

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::NewFrame(void)

{
  ImVec2 *pIVar1;
  ImDrawListFlags *pIVar2;
  bool *pbVar3;
  int *piVar4;
  float *pfVar5;
  ImGuiNavMoveResult *pIVar6;
  undefined8 uVar7;
  ImGuiID IVar8;
  ImGuiInputSource IVar9;
  ImGuiID IVar10;
  char *pcVar11;
  _func_bool_ImGuiViewport_ptr *p_Var12;
  ImGuiWindow **ppIVar13;
  _func_float_ImGuiViewport_ptr *p_Var14;
  _func_void_ImGuiViewport_ptr *p_Var15;
  ImGuiPopupData *pIVar16;
  ImGuiContext *pIVar17;
  ImGuiContext *pIVar18;
  ImGuiContext *pIVar19;
  ImGuiContext *pIVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  undefined4 extraout_EAX;
  int iVar24;
  int iVar25;
  ImGuiContext *g_6;
  ImGuiViewportP *pIVar26;
  ImGuiWindow *pIVar27;
  ImGuiWindow **__dest;
  ImGuiPopupData *__dest_00;
  int i;
  ImGuiViewportP *pIVar28;
  ImGuiWindow *pIVar29;
  ImGuiWindow *window_00;
  ImGuiContext *g_4;
  ImGuiViewportP **ppIVar30;
  ulong uVar31;
  ImRect *pIVar32;
  ImGuiContext *g;
  ImGuiWindow *old_nav_window;
  float *pfVar33;
  ImGuiNavLayer IVar34;
  long lVar35;
  ImFont *font;
  float *pfVar36;
  ImGuiContext *g_1;
  byte bVar37;
  ImGuiWindow *window;
  ImGuiWindow *child_window;
  ImGuiNavMoveResult *pIVar38;
  ImGuiContext *g_5;
  long lVar39;
  ulong uVar40;
  bool bVar41;
  byte bVar42;
  int iVar43;
  uint uVar44;
  uint uVar45;
  float fVar46;
  ImVec2 IVar49;
  float fVar47;
  float fVar48;
  ImVec2 IVar50;
  ImVec2 IVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar54;
  ImVec2 IVar55;
  float fVar58;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar59 [16];
  float fVar60;
  ImVec2 IVar61;
  float fVar63;
  undefined1 auVar62 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  double dVar66;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  ImVec2 local_50;
  ImRect local_48;
  ulong local_38;
  
  pIVar17 = GImGui;
  bVar42 = 0;
  GImGui->ConfigFlagsLastFrame = GImGui->ConfigFlagsCurrFrame;
  if (((pIVar17->IO).ConfigWindowsResizeFromEdges == true) &&
     (((pIVar17->IO).BackendFlags & 2) == 0)) {
    (pIVar17->IO).ConfigWindowsResizeFromEdges = false;
  }
  uVar45 = (pIVar17->IO).ConfigFlags;
  if (((uVar45 >> 10 & 1) != 0) && ((~(pIVar17->IO).BackendFlags & 0x1400U) != 0)) {
    (pIVar17->IO).ConfigFlags = uVar45 & 0xfffffbff;
  }
  pIVar17->ConfigFlagsCurrFrame = (pIVar17->IO).ConfigFlags;
  if (pIVar17->SettingsLoaded == false) {
    pcVar11 = (pIVar17->IO).IniFilename;
    if (pcVar11 != (char *)0x0) {
      LoadIniSettingsFromDisk(pcVar11);
    }
    pIVar17->SettingsLoaded = true;
  }
  if ((0.0 < pIVar17->SettingsDirtyTimer) &&
     (fVar46 = pIVar17->SettingsDirtyTimer - (pIVar17->IO).DeltaTime,
     pIVar17->SettingsDirtyTimer = fVar46, fVar46 <= 0.0)) {
    pcVar11 = (pIVar17->IO).IniFilename;
    if (pcVar11 == (char *)0x0) {
      (pIVar17->IO).WantSaveIniSettings = true;
    }
    else {
      SaveIniSettingsToDisk(pcVar11);
    }
    pIVar17->SettingsDirtyTimer = 0.0;
  }
  pIVar17->Time = (double)(pIVar17->IO).DeltaTime + pIVar17->Time;
  pIVar17->WithinFrameScope = true;
  pIVar17->FrameCount = pIVar17->FrameCount + 1;
  pIVar17->TooltipOverrideCount = 0;
  pIVar17->WindowsActiveCount = 0;
  pIVar18 = GImGui;
  uVar45 = GImGui->ConfigFlagsCurrFrame;
  if (((uVar45 >> 10 & 1) != 0) && (0 < (GImGui->Viewports).Size)) {
    lVar39 = 0;
    do {
      p_Var12 = (pIVar18->PlatformIO).Platform_GetWindowMinimized;
      if ((p_Var12 != (_func_bool_ImGuiViewport_ptr *)0x0) &&
         (pIVar26 = (pIVar18->Viewports).Data[lVar39], pIVar26->PlatformWindowCreated == true)) {
        bVar21 = (*p_Var12)(&pIVar26->super_ImGuiViewport);
        (pIVar26->super_ImGuiViewport).Flags =
             (uint)bVar21 << 7 | (pIVar26->super_ImGuiViewport).Flags & 0xffffff7fU;
      }
      lVar39 = lVar39 + 1;
    } while (lVar39 < (pIVar18->Viewports).Size);
  }
  pIVar26 = *(pIVar18->Viewports).Data;
  local_48.Min.x = 0.0;
  local_48.Min.y = 0.0;
  if ((uVar45 >> 10 & 1) != 0) {
    local_48.Min = (*(pIVar18->PlatformIO).Platform_GetWindowPos)(&pIVar26->super_ImGuiViewport);
  }
  local_50 = (pIVar18->IO).DisplaySize;
  if (((uVar45 >> 10 & 1) != 0) && (((pIVar26->super_ImGuiViewport).Flags & 0x80) != 0)) {
    local_48.Min = (pIVar26->super_ImGuiViewport).Pos;
    local_50 = (pIVar26->super_ImGuiViewport).Size;
  }
  uVar40 = 0;
  AddUpdateViewport((ImGuiWindow *)0x0,0x11111111,&local_48.Min,&local_50,0x200);
  pIVar18->CurrentDpiScale = 0.0;
  pIVar18->CurrentViewport = (ImGuiViewportP *)0x0;
  pIVar18->MouseViewport = (ImGuiViewportP *)0x0;
  iVar25 = (pIVar18->Viewports).Size;
  if (0 < iVar25) {
    do {
      ppIVar30 = (pIVar18->Viewports).Data;
      iVar24 = (int)uVar40;
      pIVar28 = ppIVar30[iVar24];
      *(int *)&(pIVar28->super_ImGuiViewport).field_0x54 = iVar24;
      if ((iVar24 < 1) || (pIVar18->FrameCount + -2 <= pIVar28->LastFrameActive)) {
        bVar21 = pIVar28->PlatformWindowCreated;
        if (((uVar45 >> 10 & 1) != 0) &&
           ((((pIVar28->super_ImGuiViewport).Flags & 0x80) == 0 & bVar21) == 1)) {
          if ((pIVar28->super_ImGuiViewport).PlatformRequestMove == true) {
            IVar49 = (*(pIVar18->PlatformIO).Platform_GetWindowPos)(&pIVar28->super_ImGuiViewport);
            pIVar28->LastPlatformPos = IVar49;
            (pIVar28->super_ImGuiViewport).Pos = IVar49;
          }
          if ((pIVar28->super_ImGuiViewport).PlatformRequestResize == true) {
            IVar49 = (*(pIVar18->PlatformIO).Platform_GetWindowSize)(&pIVar28->super_ImGuiViewport);
            pIVar28->LastPlatformSize = IVar49;
            (pIVar28->super_ImGuiViewport).Size = IVar49;
          }
        }
        UpdateViewportPlatformMonitor(pIVar28);
        pIVar28->Alpha = 1.0;
        if (((pIVar28->super_ImGuiViewport).Flags & 0x200) != 0) {
          pIVar1 = &(pIVar28->super_ImGuiViewport).Pos;
          IVar49 = *pIVar1;
          IVar50 = pIVar28->LastPos;
          iVar25 = -(uint)(IVar49.x - IVar50.x != 0.0);
          iVar43 = -(uint)(IVar49.y - IVar50.y != 0.0);
          auVar52._4_4_ = iVar43;
          auVar52._0_4_ = iVar25;
          auVar52._8_4_ = iVar43;
          auVar52._12_4_ = iVar43;
          auVar65._8_8_ = auVar52._8_8_;
          auVar65._4_4_ = iVar25;
          auVar65._0_4_ = iVar25;
          iVar25 = movmskpd(extraout_EAX,auVar65);
          if (iVar25 != 0) {
            TranslateWindowsInViewport(pIVar28,&pIVar28->LastPos,pIVar1);
          }
        }
        p_Var14 = (pIVar18->PlatformIO).Platform_GetWindowDpiScale;
        if ((p_Var14 == (_func_float_ImGuiViewport_ptr *)0x0) || (bVar21 == false)) {
          if ((long)pIVar28->PlatformMonitor == -1) {
            fVar46 = (pIVar28->super_ImGuiViewport).DpiScale;
            uVar44 = -(uint)(fVar46 != 0.0);
            fVar46 = (float)(~uVar44 & 0x3f800000 | (uint)fVar46 & uVar44);
          }
          else {
            fVar46 = (pIVar18->PlatformIO).Monitors.Data[pIVar28->PlatformMonitor].DpiScale;
          }
        }
        else {
          fVar46 = (*p_Var14)(&pIVar28->super_ImGuiViewport);
        }
        fVar47 = (pIVar28->super_ImGuiViewport).DpiScale;
        if ((fVar47 != 0.0) || (NAN(fVar47))) {
          if (((fVar46 != fVar47) || (NAN(fVar46) || NAN(fVar47))) &&
             (((pIVar18->IO).ConfigFlags & 0x4000) != 0)) {
            ScaleWindowsInViewport(pIVar28,fVar46 / fVar47);
          }
        }
        (pIVar28->super_ImGuiViewport).DpiScale = fVar46;
        uVar40 = (ulong)(iVar24 + 1);
      }
      else {
        lVar39 = (long)(pIVar18->Windows).Size;
        if (0 < lVar39) {
          ppIVar13 = (pIVar18->Windows).Data;
          lVar35 = 0;
          do {
            pIVar27 = ppIVar13[lVar35];
            if (pIVar27->Viewport == pIVar28) {
              pIVar27->Viewport = (ImGuiViewportP *)0x0;
              ppIVar13[lVar35]->ViewportOwned = false;
            }
            lVar35 = lVar35 + 1;
          } while (lVar39 != lVar35);
        }
        if (pIVar28 == pIVar18->MouseLastHoveredViewport) {
          pIVar18->MouseLastHoveredViewport = (ImGuiViewportP *)0x0;
        }
        memmove(ppIVar30 + uVar40,ppIVar30 + uVar40 + 1,(~uVar40 + (long)iVar25) * 8);
        (pIVar18->Viewports).Size = (pIVar18->Viewports).Size + -1;
        DestroyPlatformWindow(pIVar28);
        IM_DELETE<ImGuiViewportP>(pIVar28);
      }
      iVar25 = (pIVar18->Viewports).Size;
    } while ((int)uVar40 < iVar25);
  }
  if ((uVar45 >> 10 & 1) == 0) {
LAB_00153c09:
    pIVar18->MouseViewport = pIVar26;
  }
  else {
    if (((pIVar18->IO).BackendFlags & 0x800) == 0) {
LAB_00153cf2:
      pIVar26 = FindHoveredViewportFromPlatformWindowStack((pIVar18->IO).MousePos);
    }
    else {
      IVar8 = (pIVar18->IO).MouseHoveredViewport;
      if ((IVar8 != 0) && (lVar39 = (long)(GImGui->Viewports).Size, 0 < lVar39)) {
        lVar35 = 0;
        do {
          pIVar26 = (GImGui->Viewports).Data[lVar35];
          if ((pIVar26->super_ImGuiViewport).ID == IVar8) goto LAB_00153cdf;
          lVar35 = lVar35 + 1;
        } while (lVar39 != lVar35);
      }
      pIVar26 = (ImGuiViewportP *)0x0;
LAB_00153cdf:
      if (pIVar26 == (ImGuiViewportP *)0x0) {
        pIVar26 = (ImGuiViewportP *)0x0;
      }
      else if (((pIVar26->super_ImGuiViewport).Flags & 0x10) != 0) goto LAB_00153cf2;
    }
    pIVar28 = pIVar26;
    if (pIVar26 == (ImGuiViewportP *)0x0) {
      if (pIVar18->MouseLastHoveredViewport == (ImGuiViewportP *)0x0) {
        pIVar28 = *(pIVar18->Viewports).Data;
        goto LAB_001543e8;
      }
    }
    else {
LAB_001543e8:
      pIVar18->MouseLastHoveredViewport = pIVar28;
    }
    ppIVar30 = &pIVar18->MovingWindow->Viewport;
    if (pIVar18->MovingWindow == (ImGuiWindow *)0x0) {
      ppIVar30 = &pIVar18->MouseLastHoveredViewport;
    }
    pIVar28 = *ppIVar30;
    pIVar18->MouseViewport = pIVar28;
    if (pIVar18->DragDropActive == true && pIVar26 == (ImGuiViewportP *)0x0) {
      pIVar26 = pIVar18->MouseLastHoveredViewport;
    }
    if ((pIVar18->DragDropActive == false) && (pIVar18->ActiveId != 0)) {
      bVar21 = true;
      if ((GImGui->IO).MouseDown[0] == false) {
        uVar40 = 0;
        do {
          uVar31 = uVar40;
          if (uVar31 == 4) {
            uVar31 = 4;
            break;
          }
          uVar40 = uVar31 + 1;
        } while ((GImGui->IO).MouseDown[uVar31 + 1] != true);
        bVar21 = uVar31 < 4;
      }
      if (!bVar21) goto LAB_00154e87;
    }
    else {
LAB_00154e87:
      if (((pIVar26 != (ImGuiViewportP *)0x0) && (pIVar26 != pIVar28)) &&
         (((pIVar26->super_ImGuiViewport).Flags & 0x10) == 0)) goto LAB_00153c09;
    }
  }
  ((pIVar17->IO).Fonts)->Locked = true;
  font = (GImGui->IO).FontDefault;
  if (font == (ImFont *)0x0) {
    font = *(((GImGui->IO).Fonts)->Fonts).Data;
  }
  SetCurrentFont(font);
  lVar39 = (long)(pIVar17->Viewports).Size;
  if (lVar39 < 1) {
    fVar46 = 3.4028235e+38;
    fVar47 = 3.4028235e+38;
    fVar60 = -3.4028235e+38;
    fVar48 = -3.4028235e+38;
  }
  else {
    fVar46 = 3.4028235e+38;
    fVar47 = 3.4028235e+38;
    fVar48 = -3.4028235e+38;
    lVar35 = 0;
    do {
      pIVar26 = (pIVar17->Viewports).Data[lVar35];
      IVar49 = (pIVar26->super_ImGuiViewport).Pos;
      IVar50 = (pIVar26->super_ImGuiViewport).Size;
      fVar54 = IVar49.x;
      fVar60 = IVar50.x + fVar54;
      fVar58 = IVar49.y;
      fVar63 = IVar50.y + fVar58;
      uVar45 = -(uint)(fVar48 < fVar63);
      fVar60 = (float)((uint)fVar60 & -(uint)(0.0 < fVar60));
      fVar46 = (float)(~-(uint)(fVar54 < fVar46) & (uint)fVar46 |
                      (uint)fVar54 & -(uint)(fVar54 < fVar46));
      fVar47 = (float)(~-(uint)(fVar58 < fVar47) & (uint)fVar47 |
                      (uint)fVar58 & -(uint)(fVar58 < fVar47));
      fVar48 = (float)(~uVar45 & (uint)fVar48 | (uint)fVar63 & uVar45);
      lVar35 = lVar35 + 1;
    } while (lVar39 != lVar35);
  }
  (pIVar17->DrawListSharedData).ClipRectFullscreen.x = fVar46;
  (pIVar17->DrawListSharedData).ClipRectFullscreen.y = fVar47;
  (pIVar17->DrawListSharedData).ClipRectFullscreen.z = fVar60;
  (pIVar17->DrawListSharedData).ClipRectFullscreen.w = fVar48;
  (pIVar17->DrawListSharedData).CurveTessellationTol = (pIVar17->Style).CurveTessellationTol;
  uVar45 = (uint)(pIVar17->Style).AntiAliasedLines;
  (pIVar17->DrawListSharedData).InitialFlags = uVar45;
  if ((pIVar17->Style).AntiAliasedFill != false) {
    (pIVar17->DrawListSharedData).InitialFlags = uVar45 | 2;
  }
  if (((pIVar17->IO).BackendFlags & 8) != 0) {
    pIVar2 = &(pIVar17->DrawListSharedData).InitialFlags;
    *(byte *)pIVar2 = (byte)*pIVar2 | 4;
  }
  if (0 < (pIVar17->Viewports).Size) {
    lVar39 = 0;
    do {
      pIVar26 = (pIVar17->Viewports).Data[lVar39];
      (pIVar26->super_ImGuiViewport).DrawData = (ImDrawData *)0x0;
      (pIVar26->DrawDataP).Valid = false;
      (pIVar26->DrawDataP).OwnerViewport = (ImGuiViewport *)0x0;
      (pIVar26->DrawDataP).CmdLists = (ImDrawList **)0x0;
      (pIVar26->DrawDataP).CmdListsCount = 0;
      (pIVar26->DrawDataP).TotalIdxCount = 0;
      (pIVar26->DrawDataP).TotalVtxCount = 0;
      (pIVar26->DrawDataP).DisplayPos.x = 0.0;
      *(undefined8 *)&(pIVar26->DrawDataP).DisplayPos.y = 0;
      (pIVar26->DrawDataP).DisplaySize.x = 0.0;
      (pIVar26->DrawDataP).DisplaySize.y = 0.0;
      (pIVar26->DrawDataP).FramebufferScale.x = 0.0;
      (pIVar26->DrawDataP).FramebufferScale.y = 0.0;
      lVar39 = lVar39 + 1;
    } while (lVar39 < (pIVar17->Viewports).Size);
  }
  pIVar18 = GImGui;
  if ((pIVar17->DragDropActive != false) &&
     (IVar8 = (pIVar17->DragDropPayload).SourceId, IVar8 == pIVar17->ActiveId)) {
    if (GImGui->ActiveId == IVar8) {
      GImGui->ActiveIdIsAlive = IVar8;
    }
    if (pIVar18->ActiveIdPreviousFrame == IVar8) {
      pIVar18->ActiveIdPreviousFrameIsAlive = true;
    }
  }
  if (pIVar17->HoveredIdPreviousFrame == 0) {
    pIVar17->HoveredIdTimer = 0.0;
LAB_00153e03:
    pIVar17->HoveredIdNotActiveTimer = 0.0;
  }
  else if ((pIVar17->HoveredId != 0) && (pIVar17->ActiveId == pIVar17->HoveredId))
  goto LAB_00153e03;
  IVar8 = pIVar17->HoveredId;
  if ((IVar8 != 0) &&
     (pIVar17->HoveredIdTimer = (pIVar17->IO).DeltaTime + pIVar17->HoveredIdTimer,
     pIVar17->ActiveId != IVar8)) {
    pIVar17->HoveredIdNotActiveTimer = (pIVar17->IO).DeltaTime + pIVar17->HoveredIdNotActiveTimer;
  }
  pIVar17->HoveredIdPreviousFrame = IVar8;
  pIVar17->HoveredId = 0;
  pIVar17->HoveredIdAllowOverlap = false;
  IVar8 = pIVar17->ActiveId;
  if (((pIVar17->ActiveIdIsAlive != IVar8) && (IVar8 != 0)) &&
     (pIVar17->ActiveIdPreviousFrame == IVar8)) {
    ClearActiveID();
  }
  IVar8 = pIVar17->ActiveId;
  if (IVar8 != 0) {
    pIVar17->ActiveIdTimer = (pIVar17->IO).DeltaTime + pIVar17->ActiveIdTimer;
  }
  pIVar17->LastActiveIdTimer = (pIVar17->IO).DeltaTime + pIVar17->LastActiveIdTimer;
  pIVar17->ActiveIdPreviousFrame = IVar8;
  pIVar17->ActiveIdPreviousFrameWindow = pIVar17->ActiveIdWindow;
  pIVar17->ActiveIdPreviousFrameHasBeenEditedBefore = pIVar17->ActiveIdHasBeenEditedBefore;
  pIVar17->ActiveIdIsAlive = 0;
  pIVar17->ActiveIdHasBeenEditedThisFrame = false;
  pIVar17->ActiveIdPreviousFrameIsAlive = false;
  pIVar17->ActiveIdIsJustActivated = false;
  if (IVar8 != pIVar17->TempInputTextId && pIVar17->TempInputTextId != 0) {
    pIVar17->TempInputTextId = 0;
  }
  if (IVar8 == 0) {
    pIVar17->ActiveIdUsingNavDirMask = 0;
    pIVar17->ActiveIdUsingNavInputMask = 0;
    pIVar17->ActiveIdUsingKeyInputMask = 0;
  }
  pIVar17->DragDropAcceptIdPrev = pIVar17->DragDropAcceptIdCurr;
  pIVar17->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
  pIVar17->DragDropAcceptIdCurr = 0;
  pIVar17->DragDropWithinSourceOrTarget = false;
  memcpy((pIVar17->IO).KeysDownDurationPrev,(pIVar17->IO).KeysDownDuration,0x800);
  lVar39 = 0x148;
  do {
    fVar46 = -1.0;
    if (*(char *)((long)(pIVar17->IO).KeyMap + lVar39 + -0x3c) == '\x01') {
      fVar47 = *(float *)((long)pIVar17 + lVar39 * 4 + -0x80);
      fVar46 = 0.0;
      if (0.0 <= fVar47) {
        fVar46 = fVar47 + (pIVar17->IO).DeltaTime;
      }
    }
    *(float *)((long)pIVar17 + lVar39 * 4 + -0x80) = fVar46;
    pIVar18 = GImGui;
    lVar39 = lVar39 + 1;
  } while (lVar39 != 0x348);
  (GImGui->IO).WantSetMousePos = false;
  uVar45 = (pIVar18->IO).ConfigFlags;
  if ((uVar45 & 2) == 0) {
    bVar37 = 0;
  }
  else {
    bVar37 = (byte)(pIVar18->IO).BackendFlags & 1;
  }
  if ((bVar37 != 0) &&
     (((0.0 < (pIVar18->IO).NavInputs[0] || (0.0 < (pIVar18->IO).NavInputs[2])) ||
      ((0.0 < (pIVar18->IO).NavInputs[1] || (0.0 < (pIVar18->IO).NavInputs[3])))))) {
    pIVar18->NavInputSource = ImGuiInputSource_NavGamepad;
  }
  if ((uVar45 & 1) != 0) {
    lVar39 = (long)(pIVar18->IO).KeyMap[0xc];
    if ((-1 < lVar39) && ((pIVar18->IO).KeysDown[lVar39] == true)) {
      (pIVar18->IO).NavInputs[0] = 1.0;
      pIVar18->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    lVar39 = (long)(pIVar18->IO).KeyMap[0xd];
    if ((-1 < lVar39) && ((pIVar18->IO).KeysDown[lVar39] == true)) {
      (pIVar18->IO).NavInputs[2] = 1.0;
      pIVar18->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    lVar39 = (long)(pIVar18->IO).KeyMap[0xe];
    if ((-1 < lVar39) && ((pIVar18->IO).KeysDown[lVar39] == true)) {
      (pIVar18->IO).NavInputs[1] = 1.0;
      pIVar18->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    lVar39 = (long)(pIVar18->IO).KeyMap[1];
    if ((-1 < lVar39) && ((pIVar18->IO).KeysDown[lVar39] == true)) {
      (pIVar18->IO).NavInputs[0x11] = 1.0;
      pIVar18->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    lVar39 = (long)(pIVar18->IO).KeyMap[2];
    if ((-1 < lVar39) && ((pIVar18->IO).KeysDown[lVar39] == true)) {
      (pIVar18->IO).NavInputs[0x12] = 1.0;
      pIVar18->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    lVar39 = (long)(pIVar18->IO).KeyMap[3];
    if ((-1 < lVar39) && ((pIVar18->IO).KeysDown[lVar39] == true)) {
      (pIVar18->IO).NavInputs[0x13] = 1.0;
      pIVar18->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    lVar39 = (long)(pIVar18->IO).KeyMap[4];
    if ((-1 < lVar39) && ((pIVar18->IO).KeysDown[lVar39] == true)) {
      (pIVar18->IO).NavInputs[0x14] = 1.0;
      pIVar18->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar21 = (pIVar18->IO).KeyCtrl;
    if (bVar21 == true) {
      (pIVar18->IO).NavInputs[0xe] = 1.0;
    }
    if ((pIVar18->IO).KeyShift == true) {
      (pIVar18->IO).NavInputs[0xf] = 1.0;
    }
    if ((bVar21 == false) && ((pIVar18->IO).KeyAlt != false)) {
      (pIVar18->IO).NavInputs[0x10] = 1.0;
    }
  }
  pfVar5 = (pIVar18->IO).NavInputsDownDuration;
  pfVar33 = pfVar5;
  pfVar36 = (pIVar18->IO).NavInputsDownDurationPrev;
  for (lVar39 = 0x15; lVar39 != 0; lVar39 = lVar39 + -1) {
    *pfVar36 = *pfVar33;
    pfVar33 = pfVar33 + (ulong)bVar42 * -2 + 1;
    pfVar36 = pfVar36 + (ulong)bVar42 * -2 + 1;
  }
  lVar39 = 0;
  do {
    fVar46 = -1.0;
    if (0.0 < (pIVar18->IO).NavInputs[lVar39]) {
      fVar46 = 0.0;
      if (0.0 <= pfVar5[lVar39]) {
        fVar46 = pfVar5[lVar39] + (pIVar18->IO).DeltaTime;
      }
    }
    pfVar5[lVar39] = fVar46;
    lVar39 = lVar39 + 1;
  } while (lVar39 != 0x15);
  IVar8 = pIVar18->NavInitResultId;
  if ((IVar8 != 0) &&
     (((pIVar18->NavDisableHighlight != true || (pIVar18->NavInitRequestFromMove == true)) &&
      (pIVar27 = pIVar18->NavWindow, pIVar27 != (ImGuiWindow *)0x0)))) {
    IVar34 = pIVar18->NavLayer;
    if (pIVar18->NavInitRequestFromMove == true) {
      pIVar18->NavId = IVar8;
      pIVar27->NavLastIds[(int)IVar34] = IVar8;
      IVar49 = (pIVar18->NavInitResultRectRel).Max;
      pIVar27->NavRectRel[(int)IVar34].Min = (pIVar18->NavInitResultRectRel).Min;
      (&pIVar27->NavRectRel[(int)IVar34].Min)[1] = IVar49;
      pIVar18->NavMousePosDirty = true;
      pIVar18->NavDisableHighlight = false;
      pIVar18->NavDisableMouseHover = true;
    }
    else {
      pIVar18->NavId = IVar8;
      pIVar27->NavLastIds[(int)IVar34] = IVar8;
    }
    IVar49 = (pIVar18->NavInitResultRectRel).Max;
    pIVar1 = &pIVar18->NavWindow->NavRectRel[pIVar18->NavLayer].Min;
    *pIVar1 = (pIVar18->NavInitResultRectRel).Min;
    pIVar1[1] = IVar49;
  }
  pIVar18->NavInitRequest = false;
  pIVar18->NavInitRequestFromMove = false;
  pIVar18->NavInitResultId = 0;
  pIVar18->NavJustMovedToId = 0;
  if (pIVar18->NavMoveRequest == true) {
    IVar8 = (pIVar18->NavMoveResultLocal).ID;
    if ((IVar8 == 0) && ((pIVar18->NavMoveResultOther).ID == 0)) {
      if (pIVar18->NavId != 0) {
        pIVar18->NavDisableHighlight = false;
        pIVar18->NavDisableMouseHover = true;
      }
    }
    else {
      pIVar6 = &pIVar18->NavMoveResultOther;
      pIVar38 = &pIVar18->NavMoveResultLocal;
      if (IVar8 == 0) {
        pIVar38 = pIVar6;
      }
      if ((((pIVar18->NavMoveRequestFlags & 0x20U) != 0) &&
          (IVar8 = (pIVar18->NavMoveResultLocalVisibleSet).ID, IVar8 != 0)) &&
         (IVar8 != pIVar18->NavId)) {
        pIVar38 = &pIVar18->NavMoveResultLocalVisibleSet;
      }
      if (((pIVar38 != pIVar6) && (pIVar6->ID != 0)) &&
         (((pIVar18->NavMoveResultOther).Window)->ParentWindow == pIVar18->NavWindow)) {
        fVar46 = (pIVar18->NavMoveResultOther).DistBox;
        fVar47 = pIVar38->DistBox;
        if (fVar47 <= fVar46) {
          if (((fVar46 != fVar47) || (NAN(fVar46) || NAN(fVar47))) ||
             (pfVar5 = &(pIVar18->NavMoveResultOther).DistCenter,
             pIVar38->DistCenter < *pfVar5 || pIVar38->DistCenter == *pfVar5)) goto LAB_00154393;
        }
        pIVar38 = pIVar6;
      }
LAB_00154393:
      if (pIVar18->NavLayer == ImGuiNavLayer_Main) {
        if ((pIVar18->NavMoveRequestFlags & 0x40U) == 0) {
          IVar49 = pIVar38->Window->Pos;
          IVar50 = (pIVar38->RectRel).Min;
          fVar46 = IVar49.x;
          local_48.Min.x = IVar50.x + fVar46;
          fVar47 = IVar49.y;
          local_48.Min.y = IVar50.y + fVar47;
          IVar49 = (pIVar38->RectRel).Max;
          local_48.Max.x = IVar49.x + fVar46;
          local_48.Max.y = IVar49.y + fVar47;
          IVar49 = ScrollToBringRectIntoView(pIVar38->Window,&local_48);
        }
        else {
          fVar46 = 0.0;
          if (pIVar18->NavMoveDir == 2) {
            fVar46 = (pIVar38->Window->ScrollMax).y;
          }
          pIVar27 = pIVar38->Window;
          IVar49 = (ImVec2)((ulong)(uint)((pIVar27->Scroll).y - fVar46) << 0x20);
          (pIVar27->ScrollTarget).y = fVar46;
          (pIVar27->ScrollTargetCenterRatio).y = 0.0;
        }
        fVar46 = (pIVar38->RectRel).Min.y;
        fVar47 = (pIVar38->RectRel).Max.x;
        fVar48 = (pIVar38->RectRel).Max.y;
        (pIVar38->RectRel).Min.x = (pIVar38->RectRel).Min.x - IVar49.x;
        (pIVar38->RectRel).Min.y = fVar46 - IVar49.y;
        (pIVar38->RectRel).Max.x = fVar47 - IVar49.x;
        (pIVar38->RectRel).Max.y = fVar48 - IVar49.y;
      }
      ClearActiveID();
      pIVar18->NavWindow = pIVar38->Window;
      IVar8 = pIVar38->ID;
      if (pIVar18->NavId != IVar8) {
        pIVar18->NavJustMovedToId = IVar8;
        pIVar18->NavJustMovedToMultiSelectScopeId = pIVar38->SelectScopeId;
      }
      pIVar19 = GImGui;
      IVar34 = pIVar18->NavLayer;
      GImGui->NavId = IVar8;
      pIVar27 = pIVar19->NavWindow;
      pIVar27->NavLastIds[(int)IVar34] = IVar8;
      IVar49 = (pIVar38->RectRel).Max;
      pIVar1 = &pIVar27->NavRectRel[(int)IVar34].Min;
      *pIVar1 = (pIVar38->RectRel).Min;
      pIVar1[1] = IVar49;
      pIVar19->NavMousePosDirty = true;
      pIVar19->NavDisableHighlight = false;
      pIVar19->NavDisableMouseHover = true;
      pIVar18->NavMoveFromClampedRefRect = false;
    }
  }
  if (pIVar18->NavMoveRequestForward == ImGuiNavForward_ForwardActive) {
    if (((pIVar18->NavMoveResultLocal).ID == 0) && ((pIVar18->NavMoveResultOther).ID == 0)) {
      pIVar18->NavDisableHighlight = false;
    }
    pIVar18->NavMoveRequestForward = ImGuiNavForward_None;
  }
  if ((pIVar18->NavMousePosDirty == true) && (pIVar18->NavIdIsAlive == true)) {
    if ((((pIVar18->IO).ConfigFlags & 4) != 0) &&
       ((((((pIVar18->IO).BackendFlags & 4) != 0 && (pIVar18->NavDisableHighlight == false)) &&
         (pIVar18->NavDisableMouseHover == true)) && (pIVar18->NavWindow != (ImGuiWindow *)0x0)))) {
      IVar49 = NavCalcPreferredRefPos();
      (pIVar18->IO).MousePosPrev = IVar49;
      (pIVar18->IO).MousePos = IVar49;
      (pIVar18->IO).WantSetMousePos = true;
    }
    pIVar18->NavMousePosDirty = false;
  }
  pIVar18->NavIdIsAlive = false;
  pIVar18->NavJustTabbedId = 0;
  pIVar27 = pIVar18->NavWindow;
  pIVar29 = pIVar27;
  if (pIVar27 != (ImGuiWindow *)0x0) {
    do {
      if ((pIVar29->Flags & 0x15000000U) != 0x1000000) {
        if (pIVar29 != pIVar27) {
          pIVar29->NavLastChildNavWindow = pIVar27;
        }
        break;
      }
      ppIVar13 = &pIVar29->ParentWindow;
      pIVar29 = *ppIVar13;
    } while (*ppIVar13 != (ImGuiWindow *)0x0);
    if (((pIVar27 != (ImGuiWindow *)0x0) && (pIVar27->NavLastChildNavWindow != (ImGuiWindow *)0x0))
       && (pIVar18->NavLayer == ImGuiNavLayer_Main)) {
      pIVar27->NavLastChildNavWindow = (ImGuiWindow *)0x0;
    }
  }
  pIVar19 = GImGui;
  pIVar27 = GetTopMostPopupModal();
  if (pIVar27 == (ImGuiWindow *)0x0) {
    if ((pIVar19->NavWindowingTargetAnim != (ImGuiWindow *)0x0) &&
       (pIVar19->NavWindowingTarget == (ImGuiWindow *)0x0)) {
      fVar46 = (pIVar19->IO).DeltaTime * -10.0 + pIVar19->NavWindowingHighlightAlpha;
      fVar46 = (float)(-(uint)(0.0 <= fVar46) & (uint)fVar46);
      pIVar19->NavWindowingHighlightAlpha = fVar46;
      if ((pIVar19->DimBgRatio <= 0.0) && (fVar46 <= 0.0)) {
        pIVar19->NavWindowingTargetAnim = (ImGuiWindow *)0x0;
      }
    }
    if (pIVar19->NavWindowingTarget == (ImGuiWindow *)0x0) {
      bVar21 = (pIVar19->IO).NavInputsDownDuration[3] == 0.0;
      if ((((pIVar19->IO).KeyCtrl != true) || (iVar25 = (pIVar19->IO).KeyMap[0], iVar25 < 0)) ||
         (bVar41 = IsKeyPressed(iVar25,true), !bVar41)) goto LAB_0015475c;
      bVar42 = (byte)(pIVar19->IO).ConfigFlags & 1;
    }
    else {
      bVar21 = false;
LAB_0015475c:
      bVar42 = 0;
    }
    if (bVar21 || bVar42 != 0) {
      pIVar27 = pIVar19->NavWindow;
      if (pIVar27 == (ImGuiWindow *)0x0) {
        pIVar27 = FindWindowNavFocusable((pIVar19->WindowsFocusOrder).Size + -1,-0x7fffffff,-1);
      }
      if (pIVar27 != (ImGuiWindow *)0x0) {
        pIVar19->NavWindowingTargetAnim = pIVar27;
        pIVar19->NavWindowingTarget = pIVar27;
        pIVar19->NavWindowingTimer = 0.0;
        pIVar19->NavWindowingHighlightAlpha = 0.0;
        pIVar19->NavWindowingToggleLayer = (bool)(bVar42 ^ 1);
        pIVar19->NavInputSource = ImGuiInputSource_NavGamepad - bVar42;
      }
    }
    fVar46 = (pIVar19->IO).DeltaTime + pIVar19->NavWindowingTimer;
    pIVar19->NavWindowingTimer = fVar46;
    if ((pIVar19->NavWindowingTarget == (ImGuiWindow *)0x0) ||
       (pIVar19->NavInputSource != ImGuiInputSource_NavGamepad)) {
LAB_001548b6:
      bVar21 = false;
      pIVar27 = (ImGuiWindow *)0x0;
    }
    else {
      fVar47 = (fVar46 + -0.2) / 0.05;
      fVar46 = 1.0;
      if (fVar47 <= 1.0) {
        fVar46 = fVar47;
      }
      fVar46 = (float)(~-(uint)(fVar47 < 0.0) & (uint)fVar46);
      uVar44 = -(uint)(fVar46 <= pIVar19->NavWindowingHighlightAlpha);
      pIVar19->NavWindowingHighlightAlpha =
           (float)(uVar44 & (uint)pIVar19->NavWindowingHighlightAlpha | ~uVar44 & (uint)fVar46);
      fVar46 = GetNavInputAmount(0xc,ImGuiInputReadMode_RepeatSlow);
      fVar47 = GetNavInputAmount(0xd,ImGuiInputReadMode_RepeatSlow);
      iVar25 = (uint)(0.0 < fVar46) - (uint)(0.0 < fVar47);
      if (iVar25 != 0) {
        NavUpdateWindowingHighlightWindow(iVar25);
        pIVar19->NavWindowingHighlightAlpha = 1.0;
      }
      if (0.0 < (GImGui->IO).NavInputs[3]) goto LAB_001548b6;
      pbVar3 = &pIVar19->NavWindowingToggleLayer;
      *pbVar3 = (bool)(*pbVar3 &
                      (pIVar19->NavWindowingHighlightAlpha <= 1.0 &&
                      pIVar19->NavWindowingHighlightAlpha != 1.0));
      if (*pbVar3 == false) {
        pIVar27 = pIVar19->NavWindowingTarget;
        bVar21 = false;
      }
      else {
        bVar21 = pIVar19->NavWindow != (ImGuiWindow *)0x0;
        pIVar27 = (ImGuiWindow *)0x0;
      }
      pIVar19->NavWindowingTarget = (ImGuiWindow *)0x0;
    }
    if ((pIVar19->NavWindowingTarget != (ImGuiWindow *)0x0) &&
       (pIVar19->NavInputSource == ImGuiInputSource_NavKeyboard)) {
      fVar47 = (pIVar19->NavWindowingTimer + -0.2) / 0.05;
      fVar46 = 1.0;
      if (fVar47 <= 1.0) {
        fVar46 = fVar47;
      }
      fVar46 = (float)(~-(uint)(fVar47 < 0.0) & (uint)fVar46);
      uVar44 = -(uint)(fVar46 <= pIVar19->NavWindowingHighlightAlpha);
      pIVar19->NavWindowingHighlightAlpha =
           (float)(uVar44 & (uint)pIVar19->NavWindowingHighlightAlpha | ~uVar44 & (uint)fVar46);
      iVar25 = (GImGui->IO).KeyMap[0];
      if ((-1 < iVar25) && (bVar41 = IsKeyPressed(iVar25,true), bVar41)) {
        NavUpdateWindowingHighlightWindow((pIVar19->IO).KeyShift - 1 | 1);
      }
      if ((pIVar19->IO).KeyCtrl == false) {
        pIVar27 = pIVar19->NavWindowingTarget;
      }
    }
    pIVar20 = GImGui;
    fVar46 = (GImGui->IO).NavInputsDownDuration[0x10];
    if ((fVar46 == 0.0) && (!NAN(fVar46))) {
      pIVar19->NavWindowingToggleLayer = true;
    }
    bVar41 = bVar21;
    if ((((pIVar19->ActiveId == 0) || (pIVar19->ActiveIdAllowOverlap == true)) && (fVar46 < 0.0)) &&
       (((pIVar19->NavWindowingToggleLayer != false &&
         (0.0 <= (pIVar20->IO).NavInputsDownDurationPrev[0x10])) &&
        (bVar41 = true,
        (-256000.0 <= (pIVar19->IO).MousePos.x && -256000.0 <= (pIVar19->IO).MousePos.y) !=
        (-256000.0 <= (pIVar19->IO).MousePosPrev.y && -256000.0 <= (pIVar19->IO).MousePosPrev.x)))))
    {
      bVar41 = bVar21;
    }
    pIVar29 = pIVar19->NavWindowingTarget;
    if ((pIVar29 != (ImGuiWindow *)0x0) && ((pIVar29->Flags & 4) == 0)) {
      IVar9 = pIVar19->NavInputSource;
      IVar49.x = 0.0;
      IVar49.y = 0.0;
      if ((IVar9 == ImGuiInputSource_NavKeyboard) && ((pIVar19->IO).KeyShift == false)) {
        IVar49 = GetNavInputAmount2d(1,ImGuiInputReadMode_Down,0.0,0.0);
      }
      if (IVar9 == ImGuiInputSource_NavGamepad) {
        IVar49 = GetNavInputAmount2d(4,ImGuiInputReadMode_Down,0.0,0.0);
      }
      fVar46 = IVar49.y;
      if (((IVar49.x != 0.0) || (fVar46 != 0.0)) || (NAN(fVar46))) {
        fVar47 = (pIVar19->IO).DisplayFramebufferScale.x;
        fVar48 = (pIVar19->IO).DisplayFramebufferScale.y;
        if (fVar48 <= fVar47) {
          fVar47 = fVar48;
        }
        fVar47 = (float)(int)(fVar47 * (pIVar19->IO).DeltaTime * 800.0);
        IVar50 = pIVar29->RootWindow->Pos;
        local_48.Min.x = IVar50.x + IVar49.x * fVar47;
        local_48.Min.y = IVar50.y + fVar46 * fVar47;
        SetWindowPos(pIVar29->RootWindow,&local_48.Min,1);
        pIVar19->NavDisableMouseHover = true;
        if (((pIVar19->NavWindowingTarget->Flags & 0x100) == 0) &&
           (GImGui->SettingsDirtyTimer <= 0.0)) {
          GImGui->SettingsDirtyTimer = (GImGui->IO).IniSavingRate;
        }
      }
    }
    if (pIVar27 != (ImGuiWindow *)0x0) {
      pIVar29 = pIVar19->NavWindow;
      if (pIVar29 == (ImGuiWindow *)0x0) {
        pIVar26 = (ImGuiViewportP *)0x0;
LAB_00154b6d:
        ClearActiveID();
        pIVar19->NavDisableHighlight = false;
        pIVar19->NavDisableMouseHover = true;
        pIVar27 = NavRestoreLastChildNavWindow(pIVar27);
        ClosePopupsOverWindow(pIVar27,false);
        FocusWindow(pIVar27);
        if (pIVar27->NavLastIds[0] == 0) {
          NavInitWindow(pIVar27,false);
        }
        if ((pIVar27->DC).NavLayerActiveMask == 2) {
          pIVar19->NavLayer = ImGuiNavLayer_Menu;
        }
        if ((pIVar27->Viewport != pIVar26) &&
           (p_Var15 = (pIVar19->PlatformIO).Platform_SetWindowFocus,
           p_Var15 != (_func_void_ImGuiViewport_ptr *)0x0)) {
          (*p_Var15)(&pIVar27->Viewport->super_ImGuiViewport);
        }
        if (pIVar27 == (ImGuiWindow *)0x0) goto LAB_00154bee;
      }
      else if (pIVar27 != pIVar29->RootWindowDockStop) {
        pIVar26 = pIVar29->Viewport;
        goto LAB_00154b6d;
      }
      pIVar19->NavWindowingTarget = (ImGuiWindow *)0x0;
    }
LAB_00154bee:
    if ((bVar41) && (pIVar27 = pIVar19->NavWindow, pIVar29 = pIVar27, pIVar27 != (ImGuiWindow *)0x0)
       ) {
      while (window_00 = pIVar29, window_00->ParentWindow != (ImGuiWindow *)0x0) {
        if ((((window_00->DC).NavLayerActiveMask & 2) != 0) ||
           (pIVar29 = window_00->ParentWindow, (window_00->Flags & 0x15000000U) != 0x1000000))
        break;
      }
      if (window_00 != pIVar27) {
        FocusWindow(window_00);
        window_00->NavLastChildNavWindow = pIVar27;
      }
      pIVar19->NavDisableHighlight = false;
      pIVar19->NavDisableMouseHover = true;
      IVar34 = ImGuiNavLayer_Main;
      if (((pIVar19->NavWindow->DC).NavLayerActiveMask & 2) != 0) {
        IVar34 = pIVar19->NavLayer ^ ImGuiNavLayer_Menu;
      }
      if ((IVar34 == ImGuiNavLayer_Menu) && (window_00->DockNodeAsHost == (ImGuiDockNode *)0x0)) {
        pIVar19->NavWindow->NavLastIds[1] = 0;
      }
      NavRestoreLayer(IVar34);
    }
  }
  else {
    pIVar19->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((((uVar45 & 1) == 0 & (bVar37 ^ 1)) == 0) && (pIVar18->NavWindow != (ImGuiWindow *)0x0)) {
    bVar21 = (pIVar18->NavWindow->Flags & 0x40000U) == 0;
    (pIVar18->IO).NavActive = bVar21;
    if (((!bVar21) || (pIVar18->NavId == 0)) ||
       (bVar21 = true, pIVar18->NavDisableHighlight != false)) goto LAB_00154cea;
  }
  else {
    (pIVar18->IO).NavActive = false;
LAB_00154cea:
    bVar21 = pIVar18->NavWindowingTarget != (ImGuiWindow *)0x0;
  }
  (pIVar18->IO).NavVisible = bVar21;
  fVar46 = (GImGui->IO).NavInputsDownDuration[1];
  if ((fVar46 == 0.0) && (!NAN(fVar46))) {
    if (pIVar18->ActiveId == 0) {
      pIVar27 = pIVar18->NavWindow;
      if (((pIVar27 == (ImGuiWindow *)0x0) || ((pIVar27->Flags & 0x5000000U) != 0x1000000)) ||
         ((pIVar27->ParentWindow == (ImGuiWindow *)0x0 || (pIVar27 == pIVar27->RootWindowDockStop)))
         ) {
        iVar25 = (pIVar18->OpenPopupStack).Size;
        if ((long)iVar25 < 1) {
          if (pIVar18->NavLayer == ImGuiNavLayer_Main) {
            if ((pIVar27 != (ImGuiWindow *)0x0) && ((pIVar27->Flags & 0x5000000U) != 0x1000000)) {
              pIVar27->NavLastIds[0] = 0;
            }
            pIVar18->NavId = 0;
          }
          else {
            NavRestoreLayer(ImGuiNavLayer_Main);
          }
        }
        else if ((((pIVar18->OpenPopupStack).Data[(long)iVar25 + -1].Window)->Flags & 0x8000000) ==
                 0) {
          ClosePopupToLevel(iVar25 + -1,true);
        }
      }
      else {
        FocusWindow(pIVar27->ParentWindow);
        pIVar19 = GImGui;
        IVar8 = pIVar27->ChildId;
        GImGui->NavId = IVar8;
        pIVar19->NavWindow->NavLastIds[0] = IVar8;
        pIVar18->NavIdIsAlive = false;
        if (pIVar18->NavDisableMouseHover == true) {
          pIVar18->NavMousePosDirty = true;
        }
      }
    }
    else if ((GImGui->ActiveIdUsingNavInputMask & 2) == 0) {
      ClearActiveID();
    }
  }
  pIVar18->NavActivateId = 0;
  pIVar18->NavActivateDownId = 0;
  pIVar18->NavActivatePressedId = 0;
  pIVar19 = GImGui;
  pIVar18->NavInputId = 0;
  IVar8 = pIVar18->NavId;
  if ((((IVar8 != 0) && (pIVar18->NavDisableHighlight == false)) &&
      (pIVar18->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
     ((pIVar18->NavWindow != (ImGuiWindow *)0x0 && ((pIVar18->NavWindow->Flags & 0x40000) == 0)))) {
    fVar46 = (GImGui->IO).NavInputs[0];
    if (0.0 < fVar46) {
      bVar21 = (GImGui->IO).NavInputsDownDuration[0] == 0.0;
    }
    else {
      bVar21 = false;
    }
    IVar10 = pIVar18->ActiveId;
    if (bVar21 && IVar10 == 0) {
      pIVar18->NavActivateId = IVar8;
    }
    if (IVar10 == 0) {
      if (0.0 < fVar46) goto LAB_00156467;
    }
    else if (IVar10 == IVar8 && 0.0 < fVar46) {
LAB_00156467:
      pIVar18->NavActivateDownId = IVar8;
    }
    if (IVar10 == 0) {
      if (bVar21) goto LAB_0015647e;
    }
    else if ((bool)(bVar21 & IVar10 == IVar8)) {
LAB_0015647e:
      pIVar18->NavActivatePressedId = IVar8;
    }
    if (((IVar10 == 0 || IVar10 == IVar8) &&
        (fVar46 = (pIVar19->IO).NavInputsDownDuration[2], fVar46 == 0.0)) && (!NAN(fVar46))) {
      pIVar18->NavInputId = IVar8;
    }
  }
  pIVar27 = pIVar18->NavWindow;
  if ((pIVar27 != (ImGuiWindow *)0x0) && ((pIVar27->Flags & 0x40000) != 0)) {
    pIVar18->NavDisableHighlight = true;
  }
  pIVar18->NavMoveRequest = false;
  IVar10 = pIVar18->NavNextActivateId;
  if (IVar10 != 0) {
    pIVar18->NavActivateId = IVar10;
    pIVar18->NavActivateDownId = IVar10;
    pIVar18->NavActivatePressedId = IVar10;
    pIVar18->NavInputId = IVar10;
  }
  pIVar18->NavNextActivateId = 0;
  if (pIVar18->NavMoveRequestForward == ImGuiNavForward_None) {
    pIVar18->NavMoveDir = -1;
    pIVar18->NavMoveRequestFlags = 0;
    if (((pIVar27 != (ImGuiWindow *)0x0) && (pIVar18->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
       ((pIVar27->Flags & 0x40000) == 0)) {
      uVar44 = GImGui->ActiveIdUsingNavDirMask;
      if (((uVar44 & 1) == 0) &&
         ((fVar46 = GetNavInputAmount(4,ImGuiInputReadMode_Repeat), 0.0 < fVar46 ||
          (fVar46 = GetNavInputAmount(0x11,ImGuiInputReadMode_Repeat), 0.0 < fVar46)))) {
        pIVar18->NavMoveDir = 0;
      }
      if (((uVar44 & 2) == 0) &&
         ((fVar46 = GetNavInputAmount(5,ImGuiInputReadMode_Repeat), 0.0 < fVar46 ||
          (fVar46 = GetNavInputAmount(0x12,ImGuiInputReadMode_Repeat), 0.0 < fVar46)))) {
        pIVar18->NavMoveDir = 1;
      }
      if (((uVar44 & 4) == 0) &&
         ((fVar46 = GetNavInputAmount(6,ImGuiInputReadMode_Repeat), 0.0 < fVar46 ||
          (fVar46 = GetNavInputAmount(0x13,ImGuiInputReadMode_Repeat), 0.0 < fVar46)))) {
        pIVar18->NavMoveDir = 2;
      }
      if (((uVar44 & 8) == 0) &&
         ((fVar46 = GetNavInputAmount(7,ImGuiInputReadMode_Repeat), 0.0 < fVar46 ||
          (fVar46 = GetNavInputAmount(0x14,ImGuiInputReadMode_Repeat), 0.0 < fVar46)))) {
        pIVar18->NavMoveDir = 3;
      }
    }
    pIVar18->NavMoveClipDir = pIVar18->NavMoveDir;
  }
  else {
    pIVar18->NavMoveRequestForward = ImGuiNavForward_ForwardActive;
  }
  pIVar19 = GImGui;
  fVar46 = 0.0;
  if ((((((uVar45 & 1) != 0) && (GImGui->NavMoveDir == -1)) &&
       (pIVar29 = GImGui->NavWindow, pIVar29 != (ImGuiWindow *)0x0)) &&
      (((pIVar29->Flags & 0x40000) == 0 && (GImGui->NavWindowingTarget == (ImGuiWindow *)0x0)))) &&
     ((ulong)GImGui->NavLayer == 0)) {
    iVar25 = (GImGui->IO).KeyMap[5];
    bVar21 = false;
    bVar41 = false;
    if ((-1 < (long)iVar25) && ((GImGui->IO).KeysDown[iVar25] == true)) {
      bVar41 = (GImGui->ActiveIdUsingKeyInputMask & 0x20) == 0;
    }
    iVar24 = (GImGui->IO).KeyMap[6];
    if ((-1 < (long)iVar24) && ((GImGui->IO).KeysDown[iVar24] == true)) {
      bVar21 = (GImGui->ActiveIdUsingKeyInputMask & 0x40) == 0;
    }
    local_38 = (ulong)GImGui->NavLayer;
    bVar22 = IsKeyPressed((GImGui->IO).KeyMap[7],true);
    if (bVar22) {
      bVar22 = (pIVar19->ActiveIdUsingKeyInputMask & 0x80) == 0;
    }
    else {
      bVar22 = false;
    }
    bVar23 = IsKeyPressed((pIVar19->IO).KeyMap[8],true);
    uVar40 = local_38;
    if (bVar23) {
      bVar23 = (pIVar19->ActiveIdUsingKeyInputMask & 0x100) == 0;
    }
    else {
      bVar23 = false;
    }
    fVar46 = 0.0;
    if ((bVar41 != bVar21) || (bVar22 != bVar23)) {
      if (((pIVar29->DC).NavLayerActiveMask == 0) && ((pIVar29->DC).NavHasScroll == true)) {
        bVar21 = IsKeyPressed(iVar25,true);
        if (bVar21) {
          (pIVar29->ScrollTarget).y =
               (pIVar29->Scroll).y - ((pIVar29->InnerRect).Max.y - (pIVar29->InnerRect).Min.y);
LAB_0015675b:
          (pIVar29->ScrollTargetCenterRatio).y = 0.0;
        }
        else {
          bVar21 = IsKeyPressed(iVar24,true);
          if (bVar21) {
            fVar46 = ((pIVar29->InnerRect).Max.y - (pIVar29->InnerRect).Min.y) + (pIVar29->Scroll).y
            ;
LAB_00156752:
            (pIVar29->ScrollTarget).y = fVar46;
            goto LAB_0015675b;
          }
          if (bVar22 == false) {
            if (bVar23 != false) {
              fVar46 = (pIVar29->ScrollMax).y;
              goto LAB_00156752;
            }
          }
          else {
            (pIVar29->ScrollTarget).y = 0.0;
            (pIVar29->ScrollTargetCenterRatio).y = 0.0;
          }
        }
LAB_00156766:
        fVar46 = 0.0;
      }
      else {
        pIVar32 = pIVar29->NavRectRel + local_38;
        fVar46 = pIVar19->FontBaseSize * pIVar29->FontWindowScale * pIVar29->FontDpiScale;
        if (pIVar29->ParentWindow != (ImGuiWindow *)0x0) {
          fVar46 = fVar46 * pIVar29->ParentWindow->FontWindowScale;
        }
        fVar46 = (pIVar29->NavRectRel[local_38].Max.y - pIVar29->NavRectRel[local_38].Min.y) +
                 (((pIVar29->InnerRect).Max.y - (pIVar29->InnerRect).Min.y) - fVar46);
        fVar46 = (float)(~-(uint)(fVar46 <= 0.0) & (uint)fVar46);
        bVar21 = IsKeyPressed(iVar25,true);
        if (bVar21) {
          fVar46 = -fVar46;
          pIVar19->NavMoveDir = 3;
          pIVar19->NavMoveClipDir = 2;
          pIVar19->NavMoveRequestFlags = 0x30;
        }
        else {
          bVar21 = IsKeyPressed(iVar24,true);
          if (bVar21) {
            pIVar19->NavMoveDir = 2;
            pIVar19->NavMoveClipDir = 3;
            pIVar19->NavMoveRequestFlags = 0x30;
          }
          else {
            if (bVar22 != false) {
              fVar46 = -(pIVar29->Scroll).y;
              pIVar29->NavRectRel[uVar40].Max.y = fVar46;
              pIVar29->NavRectRel[uVar40].Min.y = fVar46;
              fVar46 = (pIVar32->Min).x;
              pIVar1 = &pIVar29->NavRectRel[uVar40].Max;
              if (pIVar1->x <= fVar46 && fVar46 != pIVar1->x) {
                pIVar29->NavRectRel[uVar40].Max.x = 0.0;
                (pIVar32->Min).x = 0.0;
              }
              pIVar19->NavMoveDir = 3;
              pIVar19->NavMoveRequestFlags = 0x50;
              goto LAB_00156766;
            }
            fVar46 = 0.0;
            if (bVar23 != false) {
              fVar47 = ((pIVar29->ScrollMax).y + (pIVar29->SizeFull).y) - (pIVar29->Scroll).y;
              pIVar29->NavRectRel[uVar40].Max.y = fVar47;
              pIVar29->NavRectRel[uVar40].Min.y = fVar47;
              fVar47 = (pIVar32->Min).x;
              pIVar1 = &pIVar29->NavRectRel[uVar40].Max;
              if (pIVar1->x <= fVar47 && fVar47 != pIVar1->x) {
                pIVar29->NavRectRel[uVar40].Max.x = 0.0;
                (pIVar32->Min).x = 0.0;
              }
              pIVar19->NavMoveDir = 2;
              pIVar19->NavMoveRequestFlags = 0x50;
            }
          }
        }
      }
    }
  }
  uVar45 = pIVar18->NavMoveDir;
  if (uVar45 != 0xffffffff) {
    pIVar18->NavMoveRequest = true;
    pIVar18->NavMoveDirLast = uVar45;
  }
  bVar21 = pIVar18->NavMoveRequest;
  if (bVar21 == true && IVar8 == 0) {
    pIVar18->NavInitRequest = true;
    pIVar18->NavInitRequestFromMove = true;
    pIVar18->NavInitResultId = 0;
    pIVar18->NavDisableHighlight = false;
  }
  pIVar19 = GImGui;
  bVar41 = true;
  if (GImGui->NavMoveRequest == false) {
    bVar41 = GImGui->NavInitRequest;
  }
  GImGui->NavAnyRequest = bVar41;
  if (((pIVar27 != (ImGuiWindow *)0x0) && ((pIVar27->Flags & 0x40000) == 0)) &&
     (pIVar18->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar47 = pIVar19->FontBaseSize * pIVar27->FontWindowScale * pIVar27->FontDpiScale;
    if (pIVar27->ParentWindow != (ImGuiWindow *)0x0) {
      fVar47 = fVar47 * pIVar27->ParentWindow->FontWindowScale;
    }
    fVar47 = (float)(int)(fVar47 * 100.0 * (pIVar18->IO).DeltaTime + 0.5);
    if (((pIVar27->DC).NavLayerActiveMask == 0) && (((pIVar27->DC).NavHasScroll & bVar21) == 1)) {
      if (uVar45 < 2) {
        (pIVar27->ScrollTarget).x =
             (float)(int)(*(float *)(&DAT_0021ed90 + (ulong)(uVar45 == 0) * 4) * fVar47 +
                         (pIVar27->Scroll).x);
        (pIVar27->ScrollTargetCenterRatio).x = 0.0;
      }
      if ((uVar45 & 0xfffffffe) == 2) {
        (pIVar27->ScrollTarget).y =
             (float)(int)(*(float *)(&DAT_0021ed90 + (ulong)(uVar45 == 2) * 4) * fVar47 +
                         (pIVar27->Scroll).y);
        (pIVar27->ScrollTargetCenterRatio).y = 0.0;
      }
    }
    IVar49 = GetNavInputAmount2d(4,ImGuiInputReadMode_Down,0.1,10.0);
    fVar48 = IVar49.x;
    fVar60 = IVar49.y;
    if (((fVar48 != 0.0) || (NAN(fVar48))) && (pIVar27->ScrollbarX == true)) {
      (pIVar27->ScrollTarget).x = (float)(int)(fVar48 * fVar47 + (pIVar27->Scroll).x);
      (pIVar27->ScrollTargetCenterRatio).x = 0.0;
      pIVar18->NavMoveFromClampedRefRect = true;
    }
    if ((fVar60 != 0.0) || (NAN(fVar60))) {
      (pIVar27->ScrollTarget).y = (float)(int)(fVar60 * fVar47 + (pIVar27->Scroll).y);
      (pIVar27->ScrollTargetCenterRatio).y = 0.0;
      pIVar18->NavMoveFromClampedRefRect = true;
    }
  }
  (pIVar18->NavMoveResultLocal).ID = 0;
  (pIVar18->NavMoveResultLocal).SelectScopeId = 0;
  (pIVar18->NavMoveResultLocal).Window = (ImGuiWindow *)0x0;
  (pIVar18->NavMoveResultLocal).DistAxial = 3.4028235e+38;
  (pIVar18->NavMoveResultLocal).DistBox = 3.4028235e+38;
  (pIVar18->NavMoveResultLocal).DistCenter = 3.4028235e+38;
  (pIVar18->NavMoveResultLocal).RectRel.Min.x = 0.0;
  (pIVar18->NavMoveResultLocal).RectRel.Min.y = 0.0;
  (pIVar18->NavMoveResultLocal).RectRel.Max.x = 0.0;
  (pIVar18->NavMoveResultLocal).RectRel.Max.y = 0.0;
  (pIVar18->NavMoveResultLocalVisibleSet).ID = 0;
  (pIVar18->NavMoveResultLocalVisibleSet).SelectScopeId = 0;
  (pIVar18->NavMoveResultLocalVisibleSet).Window = (ImGuiWindow *)0x0;
  (pIVar18->NavMoveResultLocalVisibleSet).DistAxial = 3.4028235e+38;
  (pIVar18->NavMoveResultLocalVisibleSet).DistBox = 3.4028235e+38;
  (pIVar18->NavMoveResultLocalVisibleSet).DistCenter = 3.4028235e+38;
  (pIVar18->NavMoveResultLocalVisibleSet).RectRel.Min.x = 0.0;
  (pIVar18->NavMoveResultLocalVisibleSet).RectRel.Min.y = 0.0;
  (pIVar18->NavMoveResultLocalVisibleSet).RectRel.Max.x = 0.0;
  (pIVar18->NavMoveResultLocalVisibleSet).RectRel.Max.y = 0.0;
  (pIVar18->NavMoveResultOther).ID = 0;
  (pIVar18->NavMoveResultOther).SelectScopeId = 0;
  (pIVar18->NavMoveResultOther).Window = (ImGuiWindow *)0x0;
  (pIVar18->NavMoveResultOther).DistAxial = 3.4028235e+38;
  (pIVar18->NavMoveResultOther).DistBox = 3.4028235e+38;
  (pIVar18->NavMoveResultOther).DistCenter = 3.4028235e+38;
  (pIVar18->NavMoveResultOther).RectRel.Min.x = 0.0;
  (pIVar18->NavMoveResultOther).RectRel.Min.y = 0.0;
  (pIVar18->NavMoveResultOther).RectRel.Max.x = 0.0;
  (pIVar18->NavMoveResultOther).RectRel.Max.y = 0.0;
  if (((bVar21 != false) && (pIVar18->NavMoveFromClampedRefRect == true)) &&
     (pIVar18->NavLayer == ImGuiNavLayer_Main)) {
    IVar49 = (pIVar27->InnerRect).Min;
    IVar50 = (pIVar27->InnerRect).Max;
    fVar47 = (pIVar27->Pos).x;
    fVar60 = (pIVar27->Pos).y;
    fVar54 = (IVar49.x - fVar47) + -1.0;
    fVar58 = (IVar49.y - fVar60) + -1.0;
    fVar48 = (IVar50.x - fVar47) + 1.0;
    fVar60 = (IVar50.y - fVar60) + 1.0;
    fVar47 = pIVar27->NavRectRel[0].Min.x;
    if (((fVar47 < fVar54) || (pIVar27->NavRectRel[0].Min.y < fVar58)) ||
       ((fVar48 < pIVar27->NavRectRel[0].Max.x || (fVar60 < pIVar27->NavRectRel[0].Max.y)))) {
      fVar63 = pIVar19->FontBaseSize * pIVar27->FontWindowScale * pIVar27->FontDpiScale;
      if (pIVar27->ParentWindow != (ImGuiWindow *)0x0) {
        fVar63 = fVar63 * pIVar27->ParentWindow->FontWindowScale;
      }
      auVar62._0_4_ = fVar63 * 0.5;
      auVar64._0_4_ = fVar48 - fVar54;
      auVar64._4_4_ = fVar60 - fVar58;
      auVar64._8_8_ = 0;
      auVar62._4_4_ = auVar62._0_4_;
      auVar62._8_4_ = auVar62._0_4_;
      auVar62._12_4_ = auVar62._0_4_;
      auVar65 = minps(auVar64,auVar62);
      fVar54 = fVar54 + auVar65._0_4_;
      fVar58 = fVar58 + auVar65._4_4_;
      fVar63 = pIVar27->NavRectRel[0].Min.y;
      uVar45 = -(uint)(fVar54 <= fVar47);
      uVar44 = -(uint)(fVar58 <= fVar63);
      auVar53._0_4_ = fVar48 - auVar65._0_4_;
      auVar53._4_4_ = fVar60 - auVar65._4_4_;
      auVar53._8_4_ = 0.0 - auVar65._8_4_;
      auVar53._12_4_ = 0.0 - auVar65._12_4_;
      auVar56._8_8_ = 0;
      auVar56._0_4_ = pIVar27->NavRectRel[0].Max.x;
      auVar56._4_4_ = pIVar27->NavRectRel[0].Max.y;
      auVar65 = minps(auVar56,auVar53);
      pIVar27->NavRectRel[0].Min =
           (ImVec2)(CONCAT44(~uVar44 & (uint)fVar58,~uVar45 & (uint)fVar54) |
                   CONCAT44((uint)fVar63 & uVar44,(uint)fVar47 & uVar45));
      pIVar27->NavRectRel[0].Max = auVar65._0_8_;
      pIVar18->NavId = 0;
    }
    pIVar18->NavMoveFromClampedRefRect = false;
  }
  pIVar27 = pIVar18->NavWindow;
  if (pIVar27 == (ImGuiWindow *)0x0) {
LAB_00155521:
    fVar54 = 0.0;
    fVar48 = 0.0;
    fVar60 = 0.0;
    fVar47 = 0.0;
  }
  else {
    IVar34 = pIVar18->NavLayer;
    fVar47 = pIVar27->NavRectRel[IVar34].Min.x;
    fVar48 = pIVar27->NavRectRel[IVar34].Max.x;
    if (fVar48 < fVar47) goto LAB_00155521;
    fVar60 = pIVar27->NavRectRel[IVar34].Min.y;
    fVar54 = pIVar27->NavRectRel[IVar34].Max.y;
    if (fVar54 < fVar60) goto LAB_00155521;
  }
  if (pIVar27 == (ImGuiWindow *)0x0) {
    fVar60 = 0.0;
    fVar47 = 0.0;
    fVar54 = 0.0;
    fVar48 = 0.0;
  }
  else {
    fVar58 = (pIVar27->Pos).x;
    fVar63 = (pIVar27->Pos).y;
    fVar47 = fVar47 + fVar58;
    fVar60 = fVar60 + fVar63;
    fVar48 = fVar48 + fVar58;
    fVar54 = fVar54 + fVar63;
  }
  (pIVar18->NavScoringRectScreen).Min.y = fVar60 + fVar46;
  (pIVar18->NavScoringRectScreen).Max.y = fVar54 + fVar46;
  fVar46 = fVar47 + 1.0;
  if (fVar48 <= fVar47 + 1.0) {
    fVar46 = fVar48;
  }
  (pIVar18->NavScoringRectScreen).Min.x = fVar46;
  (pIVar18->NavScoringRectScreen).Max.x = fVar46;
  pIVar18->NavScoringCount = 0;
  pIVar18 = GImGui;
  IVar49 = (GImGui->IO).MousePos;
  fVar46 = IVar49.x;
  if ((-256000.0 <= fVar46) && (fVar47 = IVar49.y, -256000.0 <= fVar47)) {
    IVar50.x = (float)(int)fVar46;
    IVar50.y = (float)(int)fVar47;
    GImGui->LastValidMousePos = IVar50;
    (pIVar18->IO).MousePos = IVar50;
  }
  IVar49 = (pIVar18->IO).MousePos;
  fVar46 = IVar49.x;
  fVar47 = IVar49.y;
  if ((fVar46 < -256000.0) || (fVar47 < -256000.0)) {
LAB_00155630:
    (pIVar18->IO).MouseDelta.x = 0.0;
    (pIVar18->IO).MouseDelta.y = 0.0;
  }
  else {
    IVar49 = (pIVar18->IO).MousePosPrev;
    fVar48 = IVar49.x;
    if ((fVar48 < -256000.0) || (fVar60 = IVar49.y, fVar60 < -256000.0)) goto LAB_00155630;
    IVar61.x = fVar46 - fVar48;
    IVar61.y = fVar47 - fVar60;
    (pIVar18->IO).MouseDelta = IVar61;
  }
  if ((((pIVar18->IO).MouseDelta.x != 0.0) || (fVar46 = (pIVar18->IO).MouseDelta.y, fVar46 != 0.0))
     || (NAN(fVar46))) {
    pIVar18->NavDisableMouseHover = false;
  }
  IVar49 = (pIVar18->IO).MousePos;
  (pIVar18->IO).MousePosPrev = IVar49;
  lVar39 = -5;
  do {
    bVar21 = (pIVar18->IO).MouseDown[lVar39 + 5];
    if (bVar21 == true) {
      pfVar5 = (pIVar18->IO).MouseDownDurationPrev + lVar39;
      bVar41 = *pfVar5 <= 0.0 && *pfVar5 != 0.0;
    }
    else {
      bVar41 = false;
    }
    (pIVar18->IO).MouseDoubleClicked[lVar39] = bVar41;
    if (bVar21 == false) {
      bVar22 = 0.0 <= (pIVar18->IO).MouseDownDurationPrev[lVar39];
    }
    else {
      bVar22 = false;
    }
    (pIVar18->IO).MouseDownOwned[lVar39] = bVar22;
    fVar46 = (pIVar18->IO).MouseDownDurationPrev[lVar39];
    (&(pIVar18->IO).MouseDragMaxDistanceAbs[0].x)[lVar39] = fVar46;
    fVar48 = -1.0;
    if ((bVar21 != false) && (fVar48 = 0.0, 0.0 <= fVar46)) {
      fVar48 = fVar46 + (pIVar18->IO).DeltaTime;
    }
    (pIVar18->IO).MouseDownDurationPrev[lVar39] = fVar48;
    (pIVar18->IO).MouseReleased[lVar39] = false;
    if (bVar41 == false) {
      if (bVar21 != false) {
        fVar46 = (pIVar18->IO).MousePos.x;
        auVar67 = ZEXT816(0);
        if ((-256000.0 <= fVar46) && (-256000.0 <= fVar47)) {
          uVar7 = *(undefined8 *)((long)(pIVar18->IO).MouseClickedTime + lVar39 * 8 + -4);
          auVar67._0_4_ = fVar46 - (float)uVar7;
          auVar67._4_4_ = fVar47 - (float)((ulong)uVar7 >> 0x20);
          auVar67._8_8_ = 0;
        }
        fVar46 = (pIVar18->IO).KeysDownDuration[lVar39];
        fVar48 = auVar67._0_4_ * auVar67._0_4_ + auVar67._4_4_ * auVar67._4_4_;
        uVar45 = -(uint)(fVar48 <= fVar46);
        (pIVar18->IO).KeysDownDuration[lVar39] =
             (float)(~uVar45 & (uint)fVar48 | (uint)fVar46 & uVar45);
        uVar7 = *(undefined8 *)((pIVar18->IO).MouseDragMaxDistanceSqr + lVar39 * 2);
        fVar46 = (float)uVar7;
        fVar48 = (float)((ulong)uVar7 >> 0x20);
        auVar68._0_8_ = auVar67._0_8_ ^ 0x8000000080000000;
        auVar68._8_4_ = auVar67._8_4_ ^ 0x80000000;
        auVar68._12_4_ = auVar67._12_4_ ^ 0x80000000;
        auVar65 = maxps(auVar68,auVar67);
        uVar45 = -(uint)(auVar65._0_4_ <= fVar46);
        uVar44 = -(uint)(auVar65._4_4_ <= fVar48);
        *(ulong *)((pIVar18->IO).MouseDragMaxDistanceSqr + lVar39 * 2) =
             CONCAT44(~uVar44 & (uint)auVar65._4_4_,~uVar45 & (uint)auVar65._0_4_) |
             CONCAT44((uint)fVar48 & uVar44,(uint)fVar46 & uVar45);
      }
    }
    else {
      dVar66 = pIVar18->Time;
      if ((float)(dVar66 - *(double *)((pIVar18->IO).MouseClicked + lVar39 * 8)) <
          (pIVar18->IO).MouseDoubleClickTime) {
        fVar46 = (pIVar18->IO).MousePos.x;
        fVar48 = 0.0;
        fVar60 = 0.0;
        if ((-256000.0 <= fVar46) && (-256000.0 <= fVar47)) {
          uVar7 = *(undefined8 *)((long)(pIVar18->IO).MouseClickedTime + lVar39 * 8 + -4);
          fVar48 = fVar46 - (float)uVar7;
          fVar60 = fVar47 - (float)((ulong)uVar7 >> 0x20);
        }
        fVar46 = (pIVar18->IO).MouseDoubleClickMaxDist;
        dVar66 = -3.4028234663852886e+38;
        if (fVar48 * fVar48 + fVar60 * fVar60 < fVar46 * fVar46) {
          (pIVar18->IO).MouseReleased[lVar39] = true;
          dVar66 = -3.4028234663852886e+38;
        }
      }
      *(double *)((pIVar18->IO).MouseClicked + lVar39 * 8) = dVar66;
      *(ImVec2 *)((long)(pIVar18->IO).MouseClickedTime + lVar39 * 8 + -4) = IVar49;
      *(bool *)((long)(pIVar18->IO).MouseDownDuration + lVar39 + -3) =
           (pIVar18->IO).MouseReleased[lVar39];
      pfVar5 = (pIVar18->IO).MouseDragMaxDistanceSqr + lVar39 * 2;
      pfVar5[0] = 0.0;
      pfVar5[1] = 0.0;
      (pIVar18->IO).KeysDownDuration[lVar39] = 0.0;
    }
    if (((pIVar18->IO).MouseDown[lVar39 + 5] == false) &&
       ((pIVar18->IO).MouseDownOwned[lVar39] == false)) {
      *(undefined1 *)((long)(pIVar18->IO).MouseDownDuration + lVar39 + -3) = 0;
    }
    if ((pIVar18->IO).MouseDoubleClicked[lVar39] == true) {
      pIVar18->NavDisableMouseHover = false;
    }
    lVar39 = lVar39 + 1;
  } while (lVar39 != 0);
  fVar46 = (pIVar17->IO).DeltaTime;
  iVar25 = pIVar17->FramerateSecPerFrameIdx;
  pIVar17->FramerateSecPerFrameAccum =
       (fVar46 - pIVar17->FramerateSecPerFrame[iVar25]) + pIVar17->FramerateSecPerFrameAccum;
  pIVar17->FramerateSecPerFrame[iVar25] = fVar46;
  iVar24 = iVar25 + (int)((ulong)((long)(iVar25 + 1) * -0x77777777) >> 0x20) + 1;
  pIVar17->FramerateSecPerFrameIdx = iVar25 + 1 + ((iVar24 >> 6) - (iVar24 >> 0x1f)) * -0x78;
  uVar45 = -(uint)(0.0 < pIVar17->FramerateSecPerFrameAccum);
  (pIVar17->IO).Framerate =
       (float)(~uVar45 & 0x7f7fffff |
              (uint)(1.0 / (pIVar17->FramerateSecPerFrameAccum / 120.0)) & uVar45);
  DockContextUpdateUndocking(pIVar17);
  UpdateHoveredWindowAndCaptureFlags();
  UpdateMouseMovingWindowNewFrame();
  pIVar27 = GetTopMostPopupModal();
  if ((pIVar27 != (ImGuiWindow *)0x0) ||
     ((pIVar17->NavWindowingTarget != (ImGuiWindow *)0x0 &&
      (0.0 < pIVar17->NavWindowingHighlightAlpha)))) {
    fVar46 = (pIVar17->IO).DeltaTime * 6.0 + pIVar17->DimBgRatio;
    if (1.0 <= fVar46) {
      fVar46 = 1.0;
    }
    pIVar17->DimBgRatio = fVar46;
  }
  else {
    fVar46 = (pIVar17->IO).DeltaTime * -10.0 + pIVar17->DimBgRatio;
    pIVar17->DimBgRatio = (float)(-(uint)(0.0 <= fVar46) & (uint)fVar46);
  }
  pIVar17->MouseCursor = 0;
  pIVar17->WantTextInputNextFrame = -1;
  pIVar17->WantCaptureMouseNextFrame = -1;
  pIVar17->WantCaptureKeyboardNextFrame = -1;
  (pIVar17->PlatformImePos).x = 1.0;
  (pIVar17->PlatformImePos).y = 1.0;
  pIVar17->PlatformImePosViewport = (ImGuiViewportP *)0x0;
  pIVar18 = GImGui;
  if (GImGui->WheelingWindow != (ImGuiWindow *)0x0) {
    GImGui->WheelingWindowTimer = GImGui->WheelingWindowTimer - (GImGui->IO).DeltaTime;
    fVar46 = (pIVar18->IO).MousePos.x;
    if (((-256000.0 <= fVar46) && (fVar47 = (pIVar18->IO).MousePos.y, -256000.0 <= fVar47)) &&
       (fVar46 = fVar46 - (pIVar18->WheelingWindowRefMousePos).x,
       fVar47 = fVar47 - (pIVar18->WheelingWindowRefMousePos).y,
       fVar48 = (pIVar18->IO).MouseDragThreshold,
       fVar48 * fVar48 < fVar46 * fVar46 + fVar47 * fVar47)) {
      pIVar18->WheelingWindowTimer = 0.0;
    }
    if (pIVar18->WheelingWindowTimer <= 0.0) {
      pIVar18->WheelingWindow = (ImGuiWindow *)0x0;
      pIVar18->WheelingWindowTimer = 0.0;
    }
  }
  fVar46 = (pIVar18->IO).MouseWheel;
  if (((fVar46 != 0.0) || (fVar47 = (pIVar18->IO).MouseWheelH, fVar47 != 0.0)) || (NAN(fVar47))) {
    pIVar27 = pIVar18->WheelingWindow;
    pIVar29 = pIVar27;
    if (pIVar27 == (ImGuiWindow *)0x0) {
      pIVar29 = pIVar18->HoveredWindow;
    }
    if ((pIVar29 != (ImGuiWindow *)0x0) && (pIVar29->Collapsed == false)) {
      fVar47 = 0.0;
      if ((fVar46 != 0.0) || (NAN(fVar46))) {
        if (((pIVar18->IO).KeyCtrl == true) && ((pIVar18->IO).FontAllowUserScaling == true)) {
          if (pIVar27 != pIVar29) {
            pIVar18->WheelingWindow = pIVar29;
            pIVar18->WheelingWindowRefMousePos = (pIVar18->IO).MousePos;
            pIVar18->WheelingWindowTimer = 2.0;
          }
          fVar46 = pIVar29->FontWindowScale;
          fVar48 = (pIVar18->IO).MouseWheel * 0.1 + fVar46;
          fVar47 = 2.5;
          if (fVar48 <= 2.5) {
            fVar47 = fVar48;
          }
          fVar47 = (float)(-(uint)(fVar48 < 0.5) & 0x3f000000 |
                          ~-(uint)(fVar48 < 0.5) & (uint)fVar47);
          pIVar29->FontWindowScale = fVar47;
          if ((pIVar29->Flags & 0x1000000) == 0) {
            fVar47 = fVar47 / fVar46;
            IVar49 = pIVar29->Size;
            auVar57._8_8_ = 0;
            auVar57._0_4_ = IVar49.x;
            auVar57._4_4_ = IVar49.y;
            IVar50 = (pIVar18->IO).MousePos;
            fVar46 = (pIVar29->Pos).x;
            fVar48 = (pIVar29->Pos).y;
            auVar59._0_4_ = (IVar50.x - fVar46) * (1.0 - fVar47) * IVar49.x;
            auVar59._4_4_ = (IVar50.y - fVar48) * (1.0 - fVar47) * IVar49.y;
            auVar59._8_8_ = 0;
            auVar65 = divps(auVar59,auVar57);
            local_48.Min.x = auVar65._0_4_ + fVar46;
            local_48.Min.y = auVar65._4_4_ + fVar48;
            SetWindowPos(pIVar29,&local_48.Min,0);
            IVar51.x = (float)(int)((pIVar29->Size).x * fVar47);
            IVar51.y = (float)(int)((pIVar29->Size).y * fVar47);
            IVar55.x = (float)(int)((pIVar29->SizeFull).x * fVar47);
            IVar55.y = (float)(int)((pIVar29->SizeFull).y * fVar47);
            pIVar29->Size = IVar51;
            pIVar29->SizeFull = IVar55;
          }
          goto LAB_00155f89;
        }
        if ((pIVar18->IO).KeyShift == false) {
          fVar47 = fVar46;
        }
      }
      if (((fVar47 != 0.0) || (NAN(fVar47))) && ((pIVar18->IO).KeyCtrl == false)) {
        if (pIVar27 != pIVar29) {
          pIVar18->WheelingWindow = pIVar29;
          pIVar18->WheelingWindowRefMousePos = (pIVar18->IO).MousePos;
          pIVar18->WheelingWindowTimer = 2.0;
        }
        uVar45 = pIVar29->Flags;
        while (((uVar45 >> 0x18 & 1) != 0 &&
               (((uVar45 & 0x210) == 0x10 ||
                ((fVar46 = (pIVar29->ScrollMax).y, fVar46 == 0.0 && (!NAN(fVar46)))))))) {
          pIVar29 = pIVar29->ParentWindow;
          uVar45 = pIVar29->Flags;
        }
        if ((uVar45 & 0x210) == 0) {
          fVar46 = ((pIVar29->InnerRect).Max.y - (pIVar29->InnerRect).Min.y) * 0.67;
          fVar48 = pIVar18->FontBaseSize * pIVar29->FontWindowScale * pIVar29->FontDpiScale;
          if (pIVar29->ParentWindow != (ImGuiWindow *)0x0) {
            fVar48 = fVar48 * pIVar29->ParentWindow->FontWindowScale;
          }
          fVar60 = fVar48 * 5.0;
          if (fVar46 <= fVar48 * 5.0) {
            fVar60 = fVar46;
          }
          (pIVar29->ScrollTarget).y = (pIVar29->Scroll).y - fVar47 * (float)(int)fVar60;
          (pIVar29->ScrollTargetCenterRatio).y = 0.0;
        }
      }
      fVar46 = (pIVar18->IO).MouseWheelH;
      if (((fVar46 == 0.0) && (!NAN(fVar46))) || ((pIVar18->IO).KeyShift == true)) {
        fVar47 = (pIVar18->IO).MouseWheel;
        if ((fVar47 != 0.0) || (NAN(fVar47))) {
          fVar46 = 0.0;
          if ((pIVar18->IO).KeyShift == true) {
            fVar46 = fVar47;
          }
        }
        else {
          fVar46 = 0.0;
        }
      }
      if (((fVar46 != 0.0) || (NAN(fVar46))) && ((pIVar18->IO).KeyCtrl == false)) {
        if (pIVar18->WheelingWindow != pIVar29) {
          pIVar18->WheelingWindow = pIVar29;
          pIVar18->WheelingWindowRefMousePos = (pIVar18->IO).MousePos;
          pIVar18->WheelingWindowTimer = 2.0;
        }
        while ((uVar45 = pIVar29->Flags, (uVar45 >> 0x18 & 1) != 0 &&
               (((uVar45 & 0x210) == 0x10 ||
                ((fVar47 = (pIVar29->ScrollMax).x, fVar47 == 0.0 && (!NAN(fVar47)))))))) {
          pIVar29 = pIVar29->ParentWindow;
        }
        if ((uVar45 & 0x210) == 0) {
          fVar47 = ((pIVar29->InnerRect).Max.x - (pIVar29->InnerRect).Min.x) * 0.67;
          fVar48 = pIVar18->FontBaseSize * pIVar29->FontWindowScale * pIVar29->FontDpiScale;
          if (pIVar29->ParentWindow != (ImGuiWindow *)0x0) {
            fVar48 = fVar48 * pIVar29->ParentWindow->FontWindowScale;
          }
          fVar60 = fVar48 + fVar48;
          if (fVar47 <= fVar48 + fVar48) {
            fVar60 = fVar47;
          }
          (pIVar29->ScrollTarget).x = (pIVar29->Scroll).x - fVar46 * (float)(int)fVar60;
          (pIVar29->ScrollTargetCenterRatio).x = 0.0;
        }
      }
    }
  }
LAB_00155f89:
  pIVar27 = pIVar17->NavWindow;
  if (((pIVar27 == (ImGuiWindow *)0x0) || (pIVar27->Active != true)) ||
     (((pIVar27->Flags & 0x40000) != 0 ||
      (((pIVar17->IO).KeyCtrl != false || (iVar25 = (GImGui->IO).KeyMap[0], iVar25 < 0)))))) {
    bVar21 = false;
  }
  else {
    bVar21 = IsKeyPressed(iVar25,true);
  }
  pIVar17->FocusTabPressed = bVar21;
  if ((bVar21 != false) && (pIVar17->ActiveId == 0)) {
    pIVar17->FocusRequestNextWindow = pIVar27;
    pIVar17->FocusRequestNextCounterAll = 0x7fffffff;
    if ((pIVar17->NavId == 0) || (pIVar17->NavIdTabCounter == 0x7fffffff)) {
      iVar25 = -(uint)(pIVar17->IO).KeyShift;
    }
    else {
      iVar25 = pIVar17->NavIdTabCounter + (-(uint)(pIVar17->IO).KeyShift | 1) + 1;
    }
    pIVar17->FocusRequestNextCounterTab = iVar25;
  }
  pIVar17->FocusRequestCurrWindow = (ImGuiWindow *)0x0;
  pIVar17->FocusRequestCurrCounterAll = 0x7fffffff;
  pIVar17->FocusRequestCurrCounterTab = 0x7fffffff;
  pIVar27 = pIVar17->FocusRequestNextWindow;
  if (pIVar27 != (ImGuiWindow *)0x0) {
    pIVar17->FocusRequestCurrWindow = pIVar27;
    if ((pIVar17->FocusRequestNextCounterAll != 0x7fffffff) &&
       (iVar25 = (pIVar27->DC).FocusCounterAll, iVar25 != -1)) {
      pIVar17->FocusRequestCurrCounterAll =
           (pIVar17->FocusRequestNextCounterAll + iVar25 + 1) % (iVar25 + 1);
    }
    if ((pIVar17->FocusRequestNextCounterTab != 0x7fffffff) &&
       (iVar25 = (pIVar27->DC).FocusCounterTab, iVar25 != -1)) {
      pIVar17->FocusRequestCurrCounterTab =
           (pIVar17->FocusRequestNextCounterTab + iVar25 + 1) % (iVar25 + 1);
    }
    pIVar17->FocusRequestNextWindow = (ImGuiWindow *)0x0;
    pIVar17->FocusRequestNextCounterAll = 0x7fffffff;
    pIVar17->FocusRequestNextCounterTab = 0x7fffffff;
  }
  pIVar17->NavIdTabCounter = 0x7fffffff;
  fVar46 = (pIVar17->IO).ConfigWindowsMemoryCompactTimer;
  if (0.0 <= fVar46) {
    fVar46 = (float)pIVar17->Time - fVar46;
  }
  else {
    fVar46 = 3.4028235e+38;
  }
  if ((pIVar17->Windows).Size != 0) {
    uVar40 = 0;
    do {
      pIVar27 = (pIVar17->Windows).Data[uVar40];
      bVar21 = pIVar27->Active;
      pIVar27->WasActive = bVar21;
      pIVar27->BeginCount = 0;
      pIVar27->Active = false;
      pIVar27->WriteAccessed = false;
      if (((bVar21 == false) && (pIVar27->MemoryCompacted == false)) &&
         (pIVar27->LastTimeActive <= fVar46 && fVar46 != pIVar27->LastTimeActive)) {
        GcCompactTransientWindowBuffers(pIVar27);
      }
      uVar40 = uVar40 + 1;
    } while (uVar40 != (uint)(pIVar17->Windows).Size);
  }
  if ((pIVar17->NavWindow != (ImGuiWindow *)0x0) && (pIVar17->NavWindow->WasActive == false)) {
    FocusTopMostWindowUnderOne((ImGuiWindow *)0x0,(ImGuiWindow *)0x0);
  }
  iVar25 = (pIVar17->CurrentWindowStack).Capacity;
  if (iVar25 < 0) {
    uVar45 = iVar25 / 2 + iVar25;
    uVar40 = 0;
    if (0 < (int)uVar45) {
      uVar40 = (ulong)uVar45;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar4 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar4 = *piVar4 + 1;
    }
    __dest = (ImGuiWindow **)(*GImAllocatorAllocFunc)(uVar40 * 8,GImAllocatorUserData);
    ppIVar13 = (pIVar17->CurrentWindowStack).Data;
    if (ppIVar13 != (ImGuiWindow **)0x0) {
      memcpy(__dest,ppIVar13,(long)(pIVar17->CurrentWindowStack).Size << 3);
      ppIVar13 = (pIVar17->CurrentWindowStack).Data;
      if ((ppIVar13 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar4 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar4 = *piVar4 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar13,GImAllocatorUserData);
    }
    (pIVar17->CurrentWindowStack).Data = __dest;
    (pIVar17->CurrentWindowStack).Capacity = (int)uVar40;
  }
  (pIVar17->CurrentWindowStack).Size = 0;
  iVar25 = (pIVar17->BeginPopupStack).Capacity;
  if (iVar25 < 0) {
    uVar45 = iVar25 / 2 + iVar25;
    uVar40 = 0;
    if (0 < (int)uVar45) {
      uVar40 = (ulong)uVar45;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar4 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar4 = *piVar4 + 1;
    }
    __dest_00 = (ImGuiPopupData *)(*GImAllocatorAllocFunc)(uVar40 * 0x30,GImAllocatorUserData);
    pIVar16 = (pIVar17->BeginPopupStack).Data;
    if (pIVar16 != (ImGuiPopupData *)0x0) {
      memcpy(__dest_00,pIVar16,(long)(pIVar17->BeginPopupStack).Size * 0x30);
      pIVar16 = (pIVar17->BeginPopupStack).Data;
      if ((pIVar16 != (ImGuiPopupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar4 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar4 = *piVar4 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar16,GImAllocatorUserData);
    }
    (pIVar17->BeginPopupStack).Data = __dest_00;
    (pIVar17->BeginPopupStack).Capacity = (int)uVar40;
  }
  (pIVar17->BeginPopupStack).Size = 0;
  ClosePopupsOverWindow(pIVar17->NavWindow,false);
  DockContextUpdateDocking(pIVar17);
  pIVar18 = GImGui;
  GImGui->DebugItemPickerBreakID = 0;
  if (pIVar18->DebugItemPickerActive == true) {
    uVar45 = pIVar18->HoveredIdPreviousFrame;
    pIVar18->MouseCursor = 7;
    iVar25 = (pIVar18->IO).KeyMap[0xe];
    if ((-1 < iVar25) && (bVar21 = IsKeyPressed(iVar25,true), bVar21)) {
      pIVar18->DebugItemPickerActive = false;
    }
    if (uVar45 != 0 && (pIVar18->IO).MouseDownDuration[0] == 0.0) {
      pIVar18->DebugItemPickerBreakID = uVar45;
      pIVar18->DebugItemPickerActive = false;
    }
    *(byte *)&(pIVar18->NextWindowData).Flags = (byte)(pIVar18->NextWindowData).Flags | 0x40;
    (pIVar18->NextWindowData).BgAlphaVal = 0.6;
    BeginTooltip();
    Text("HoveredId: 0x%08X",(ulong)uVar45);
    Text("Press ESC to abort picking.");
    TextColored((GImGui->Style).Colors + (uVar45 == 0),"Click to break in debugger!");
    End();
  }
  pIVar17->WithinFrameScopeWithImplicitWindow = true;
  pIVar17 = GImGui;
  (GImGui->NextWindowData).Flags = (GImGui->NextWindowData).Flags | 2;
  (pIVar17->NextWindowData).SizeVal.x = 400.0;
  (pIVar17->NextWindowData).SizeVal.y = 400.0;
  (pIVar17->NextWindowData).SizeCond = 4;
  Begin("Debug##Default",(bool *)0x0,0);
  return;
}

Assistant:

void ImGui::NewFrame()
{
    IM_ASSERT(GImGui != NULL && "No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?");
    ImGuiContext& g = *GImGui;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    ImGuiTestEngineHook_PreNewFrame(&g);
#endif

    // Check and assert for various common IO and Configuration mistakes
    g.ConfigFlagsLastFrame = g.ConfigFlagsCurrFrame;
    NewFrameSanityChecks();
    g.ConfigFlagsCurrFrame = g.IO.ConfigFlags;

    // Load settings on first frame (if not explicitly loaded manually before)
    if (!g.SettingsLoaded)
    {
        IM_ASSERT(g.SettingsWindows.empty());
        if (g.IO.IniFilename)
            LoadIniSettingsFromDisk(g.IO.IniFilename);
        g.SettingsLoaded = true;
    }

    // Save settings (with a delay after the last modification, so we don't spam disk too much)
    if (g.SettingsDirtyTimer > 0.0f)
    {
        g.SettingsDirtyTimer -= g.IO.DeltaTime;
        if (g.SettingsDirtyTimer <= 0.0f)
        {
            if (g.IO.IniFilename != NULL)
                SaveIniSettingsToDisk(g.IO.IniFilename);
            else
                g.IO.WantSaveIniSettings = true;  // Let user know they can call SaveIniSettingsToMemory(). user will need to clear io.WantSaveIniSettings themselves.
            g.SettingsDirtyTimer = 0.0f;
        }
    }

    g.Time += g.IO.DeltaTime;
    g.WithinFrameScope = true;
    g.FrameCount += 1;
    g.TooltipOverrideCount = 0;
    g.WindowsActiveCount = 0;

    UpdateViewportsNewFrame();

    // Setup current font and draw list shared data
    // FIXME-VIEWPORT: the concept of a single ClipRectFullscreen is not ideal!
    g.IO.Fonts->Locked = true;
    SetCurrentFont(GetDefaultFont());
    IM_ASSERT(g.Font->IsLoaded());
    ImRect virtual_space(FLT_MAX, FLT_MAX, -FLT_MAX, -FLT_MAX);
    for (int n = 0; n < g.Viewports.Size; n++)
        virtual_space.Add(g.Viewports[n]->GetRect());
    g.DrawListSharedData.ClipRectFullscreen = ImVec4(virtual_space.Min.x, virtual_space.Min.y, virtual_space.Max.x, virtual_space.Max.y);
    g.DrawListSharedData.CurveTessellationTol = g.Style.CurveTessellationTol;
    g.DrawListSharedData.InitialFlags = ImDrawListFlags_None;
    if (g.Style.AntiAliasedLines)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLines;
    if (g.Style.AntiAliasedFill)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedFill;
    if (g.IO.BackendFlags & ImGuiBackendFlags_RendererHasVtxOffset)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AllowVtxOffset;

    // Mark rendering data as invalid to prevent user who may have a handle on it to use it.
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawData = NULL;
        viewport->DrawDataP.Clear();
    }

    // Drag and drop keep the source ID alive so even if the source disappear our state is consistent
    if (g.DragDropActive && g.DragDropPayload.SourceId == g.ActiveId)
        KeepAliveID(g.DragDropPayload.SourceId);

    // Clear reference to active widget if the widget isn't alive anymore
    if (!g.HoveredIdPreviousFrame)
        g.HoveredIdTimer = 0.0f;
    if (!g.HoveredIdPreviousFrame || (g.HoveredId && g.ActiveId == g.HoveredId))
        g.HoveredIdNotActiveTimer = 0.0f;
    if (g.HoveredId)
        g.HoveredIdTimer += g.IO.DeltaTime;
    if (g.HoveredId && g.ActiveId != g.HoveredId)
        g.HoveredIdNotActiveTimer += g.IO.DeltaTime;
    g.HoveredIdPreviousFrame = g.HoveredId;
    g.HoveredId = 0;
    g.HoveredIdAllowOverlap = false;
    if (g.ActiveIdIsAlive != g.ActiveId && g.ActiveIdPreviousFrame == g.ActiveId && g.ActiveId != 0)
        ClearActiveID();
    if (g.ActiveId)
        g.ActiveIdTimer += g.IO.DeltaTime;
    g.LastActiveIdTimer += g.IO.DeltaTime;
    g.ActiveIdPreviousFrame = g.ActiveId;
    g.ActiveIdPreviousFrameWindow = g.ActiveIdWindow;
    g.ActiveIdPreviousFrameHasBeenEditedBefore = g.ActiveIdHasBeenEditedBefore;
    g.ActiveIdIsAlive = 0;
    g.ActiveIdHasBeenEditedThisFrame = false;
    g.ActiveIdPreviousFrameIsAlive = false;
    g.ActiveIdIsJustActivated = false;
    if (g.TempInputTextId != 0 && g.ActiveId != g.TempInputTextId)
        g.TempInputTextId = 0;
    if (g.ActiveId == 0)
    {
        g.ActiveIdUsingNavDirMask = g.ActiveIdUsingNavInputMask = 0;
        g.ActiveIdUsingKeyInputMask = 0;
    }

    // Drag and drop
    g.DragDropAcceptIdPrev = g.DragDropAcceptIdCurr;
    g.DragDropAcceptIdCurr = 0;
    g.DragDropAcceptIdCurrRectSurface = FLT_MAX;
    g.DragDropWithinSourceOrTarget = false;

    // Update keyboard input state
    memcpy(g.IO.KeysDownDurationPrev, g.IO.KeysDownDuration, sizeof(g.IO.KeysDownDuration));
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.KeysDown); i++)
        g.IO.KeysDownDuration[i] = g.IO.KeysDown[i] ? (g.IO.KeysDownDuration[i] < 0.0f ? 0.0f : g.IO.KeysDownDuration[i] + g.IO.DeltaTime) : -1.0f;

    // Update gamepad/keyboard directional navigation
    NavUpdate();

    // Update mouse input state
    UpdateMouseInputs();

    // Calculate frame-rate for the user, as a purely luxurious feature
    g.FramerateSecPerFrameAccum += g.IO.DeltaTime - g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx];
    g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx] = g.IO.DeltaTime;
    g.FramerateSecPerFrameIdx = (g.FramerateSecPerFrameIdx + 1) % IM_ARRAYSIZE(g.FramerateSecPerFrame);
    g.IO.Framerate = (g.FramerateSecPerFrameAccum > 0.0f) ? (1.0f / (g.FramerateSecPerFrameAccum / (float)IM_ARRAYSIZE(g.FramerateSecPerFrame))) : FLT_MAX;

    // Undocking
    // (needs to be before UpdateMouseMovingWindowNewFrame so the window is already offset and following the mouse on the detaching frame)
    DockContextUpdateUndocking(&g);

    // Find hovered window
    // (needs to be before UpdateMouseMovingWindowNewFrame so we fill g.HoveredWindowUnderMovingWindow on the mouse release frame)
    UpdateHoveredWindowAndCaptureFlags();

    // Handle user moving window with mouse (at the beginning of the frame to avoid input lag or sheering)
    UpdateMouseMovingWindowNewFrame();

    // Background darkening/whitening
    if (GetTopMostPopupModal() != NULL || (g.NavWindowingTarget != NULL && g.NavWindowingHighlightAlpha > 0.0f))
        g.DimBgRatio = ImMin(g.DimBgRatio + g.IO.DeltaTime * 6.0f, 1.0f);
    else
        g.DimBgRatio = ImMax(g.DimBgRatio - g.IO.DeltaTime * 10.0f, 0.0f);

    g.MouseCursor = ImGuiMouseCursor_Arrow;
    g.WantCaptureMouseNextFrame = g.WantCaptureKeyboardNextFrame = g.WantTextInputNextFrame = -1;
    g.PlatformImePos = ImVec2(1.0f, 1.0f); // OS Input Method Editor showing on top-left of our window by default
    g.PlatformImePosViewport = NULL;

    // Mouse wheel scrolling, scale
    UpdateMouseWheel();

    // Pressing TAB activate widget focus
    g.FocusTabPressed = (g.NavWindow && g.NavWindow->Active && !(g.NavWindow->Flags & ImGuiWindowFlags_NoNavInputs) && !g.IO.KeyCtrl && IsKeyPressedMap(ImGuiKey_Tab));
    if (g.ActiveId == 0 && g.FocusTabPressed)
    {
        // Note that SetKeyboardFocusHere() sets the Next fields mid-frame. To be consistent we also
        // manipulate the Next fields even, even though they will be turned into Curr fields by the code below.
        g.FocusRequestNextWindow = g.NavWindow;
        g.FocusRequestNextCounterAll = INT_MAX;
        if (g.NavId != 0 && g.NavIdTabCounter != INT_MAX)
            g.FocusRequestNextCounterTab = g.NavIdTabCounter + 1 + (g.IO.KeyShift ? -1 : 1);
        else
            g.FocusRequestNextCounterTab = g.IO.KeyShift ? -1 : 0;
    }

    // Turn queued focus request into current one
    g.FocusRequestCurrWindow = NULL;
    g.FocusRequestCurrCounterAll = g.FocusRequestCurrCounterTab = INT_MAX;
    if (g.FocusRequestNextWindow != NULL)
    {
        ImGuiWindow* window = g.FocusRequestNextWindow;
        g.FocusRequestCurrWindow = window;
        if (g.FocusRequestNextCounterAll != INT_MAX && window->DC.FocusCounterAll != -1)
            g.FocusRequestCurrCounterAll = ImModPositive(g.FocusRequestNextCounterAll, window->DC.FocusCounterAll + 1);
        if (g.FocusRequestNextCounterTab != INT_MAX && window->DC.FocusCounterTab != -1)
            g.FocusRequestCurrCounterTab = ImModPositive(g.FocusRequestNextCounterTab, window->DC.FocusCounterTab + 1);
        g.FocusRequestNextWindow = NULL;
        g.FocusRequestNextCounterAll = g.FocusRequestNextCounterTab = INT_MAX;
    }

    g.NavIdTabCounter = INT_MAX;

    // Mark all windows as not visible and compact unused memory.
    IM_ASSERT(g.WindowsFocusOrder.Size == g.Windows.Size);
    const float memory_compact_start_time = (g.IO.ConfigWindowsMemoryCompactTimer >= 0.0f) ? (float)g.Time - g.IO.ConfigWindowsMemoryCompactTimer : FLT_MAX;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        window->WasActive = window->Active;
        window->BeginCount = 0;
        window->Active = false;
        window->WriteAccessed = false;

        // Garbage collect (this is totally functional but we may need decide if the side-effects are desirable)
        if (!window->WasActive && !window->MemoryCompacted && window->LastTimeActive < memory_compact_start_time)
            GcCompactTransientWindowBuffers(window);
    }

    // Closing the focused window restore focus to the first active root window in descending z-order
    if (g.NavWindow && !g.NavWindow->WasActive)
        FocusTopMostWindowUnderOne(NULL, NULL);

    // No window should be open at the beginning of the frame.
    // But in order to allow the user to call NewFrame() multiple times without calling Render(), we are doing an explicit clear.
    g.CurrentWindowStack.resize(0);
    g.BeginPopupStack.resize(0);
    ClosePopupsOverWindow(g.NavWindow, false);

    // Docking
    DockContextUpdateDocking(&g);

    // [DEBUG] Item picker tool - start with DebugStartItemPicker() - useful to visually select an item and break into its call-stack.
    UpdateDebugToolItemPicker();

    // Create implicit/fallback window - which we will only render it if the user has added something to it.
    // We don't use "Debug" to avoid colliding with user trying to create a "Debug" window with custom flags.
    // This fallback is particularly important as it avoid ImGui:: calls from crashing.
    g.WithinFrameScopeWithImplicitWindow = true;
    SetNextWindowSize(ImVec2(400,400), ImGuiCond_FirstUseEver);
    Begin("Debug##Default");
    IM_ASSERT(g.CurrentWindow->IsFallbackWindow == true);

#ifdef IMGUI_ENABLE_TEST_ENGINE
    ImGuiTestEngineHook_PostNewFrame(&g);
#endif
}